

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  bool bVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  int iVar76;
  undefined4 uVar77;
  vint4 bi_2;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar96;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar122;
  float fVar123;
  vint4 ai_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar124;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  vint4 bi;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  vint4 ai_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  vfloat4 a0_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar202;
  float fVar203;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar204;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar220;
  float fVar228;
  float fVar229;
  vfloat4 a0;
  undefined1 auVar221 [16];
  float fVar230;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  vfloat4 a0_1;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_35d;
  int local_33c;
  undefined1 local_338 [16];
  ulong local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  ulong local_2b8;
  Primitive *local_2b0;
  RTCFilterFunctionNArguments local_2a8;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint auStack_158 [4];
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_13c;
  undefined4 local_134;
  undefined4 local_130;
  uint local_12c;
  uint local_128;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  uint uStack_b8;
  float afStack_b4 [7];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar22;
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  
  PVar4 = prim[1];
  uVar21 = (ulong)(byte)PVar4;
  fVar207 = *(float *)(prim + uVar21 * 0x19 + 0x12);
  auVar30 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar21 * 0x19 + 6));
  auVar43._0_4_ = fVar207 * (ray->dir).field_0.m128[0];
  auVar43._4_4_ = fVar207 * (ray->dir).field_0.m128[1];
  auVar43._8_4_ = fVar207 * (ray->dir).field_0.m128[2];
  auVar43._12_4_ = fVar207 * (ray->dir).field_0.m128[3];
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 4 + 6)));
  auVar147._0_4_ = fVar207 * auVar30._0_4_;
  auVar147._4_4_ = fVar207 * auVar30._4_4_;
  auVar147._8_4_ = fVar207 * auVar30._8_4_;
  auVar147._12_4_ = fVar207 * auVar30._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 5 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 6 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0xb + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar21 + 6)));
  uVar28 = (ulong)(uint)((int)(uVar21 * 9) * 2);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 + uVar21 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  uVar25 = (ulong)(uint)((int)(uVar21 * 5) << 2);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar234._4_4_ = auVar43._0_4_;
  auVar234._0_4_ = auVar43._0_4_;
  auVar234._8_4_ = auVar43._0_4_;
  auVar234._12_4_ = auVar43._0_4_;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar31 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar207 = auVar31._0_4_;
  auVar125._0_4_ = fVar207 * auVar38._0_4_;
  fVar191 = auVar31._4_4_;
  auVar125._4_4_ = fVar191 * auVar38._4_4_;
  fVar202 = auVar31._8_4_;
  auVar125._8_4_ = fVar202 * auVar38._8_4_;
  fVar203 = auVar31._12_4_;
  auVar125._12_4_ = fVar203 * auVar38._12_4_;
  auVar84._0_4_ = auVar39._0_4_ * fVar207;
  auVar84._4_4_ = auVar39._4_4_ * fVar191;
  auVar84._8_4_ = auVar39._8_4_ * fVar202;
  auVar84._12_4_ = auVar39._12_4_ * fVar203;
  auVar35._0_4_ = auVar33._0_4_ * fVar207;
  auVar35._4_4_ = auVar33._4_4_ * fVar191;
  auVar35._8_4_ = auVar33._8_4_ * fVar202;
  auVar35._12_4_ = auVar33._12_4_ * fVar203;
  auVar31 = vfmadd231ps_fma(auVar125,auVar42,auVar30);
  auVar32 = vfmadd231ps_fma(auVar84,auVar42,auVar37);
  auVar42 = vfmadd231ps_fma(auVar35,auVar40,auVar42);
  auVar34 = vfmadd231ps_fma(auVar31,auVar234,auVar29);
  auVar32 = vfmadd231ps_fma(auVar32,auVar234,auVar41);
  auVar35 = vfmadd231ps_fma(auVar42,auVar36,auVar234);
  auVar235._4_4_ = auVar147._0_4_;
  auVar235._0_4_ = auVar147._0_4_;
  auVar235._8_4_ = auVar147._0_4_;
  auVar235._12_4_ = auVar147._0_4_;
  auVar42 = vshufps_avx(auVar147,auVar147,0x55);
  auVar31 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar207 = auVar31._0_4_;
  auVar148._0_4_ = fVar207 * auVar38._0_4_;
  fVar191 = auVar31._4_4_;
  auVar148._4_4_ = fVar191 * auVar38._4_4_;
  fVar202 = auVar31._8_4_;
  auVar148._8_4_ = fVar202 * auVar38._8_4_;
  fVar203 = auVar31._12_4_;
  auVar148._12_4_ = fVar203 * auVar38._12_4_;
  auVar110._0_4_ = auVar39._0_4_ * fVar207;
  auVar110._4_4_ = auVar39._4_4_ * fVar191;
  auVar110._8_4_ = auVar39._8_4_ * fVar202;
  auVar110._12_4_ = auVar39._12_4_ * fVar203;
  auVar97._0_4_ = auVar33._0_4_ * fVar207;
  auVar97._4_4_ = auVar33._4_4_ * fVar191;
  auVar97._8_4_ = auVar33._8_4_ * fVar202;
  auVar97._12_4_ = auVar33._12_4_ * fVar203;
  auVar30 = vfmadd231ps_fma(auVar148,auVar42,auVar30);
  auVar38 = vfmadd231ps_fma(auVar110,auVar42,auVar37);
  auVar37 = vfmadd231ps_fma(auVar97,auVar42,auVar40);
  auVar39 = vfmadd231ps_fma(auVar30,auVar235,auVar29);
  auVar40 = vfmadd231ps_fma(auVar38,auVar235,auVar41);
  auVar33 = vfmadd231ps_fma(auVar37,auVar235,auVar36);
  auVar61._16_16_ = in_YmmResult._16_16_;
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar245 = ZEXT1664(auVar29);
  auVar30 = vandps_avx512vl(auVar34,auVar29);
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  uVar28 = vcmpps_avx512vl(auVar30,auVar154,1);
  bVar27 = (bool)((byte)uVar28 & 1);
  auVar31._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar34._0_4_;
  bVar27 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar31._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar34._4_4_;
  bVar27 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar31._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar34._8_4_;
  bVar27 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar31._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar34._12_4_;
  auVar30 = vandps_avx512vl(auVar32,auVar29);
  uVar28 = vcmpps_avx512vl(auVar30,auVar154,1);
  bVar27 = (bool)((byte)uVar28 & 1);
  auVar34._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar32._0_4_;
  bVar27 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar32._4_4_;
  bVar27 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar32._8_4_;
  bVar27 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar32._12_4_;
  auVar29 = vandps_avx512vl(auVar35,auVar29);
  uVar28 = vcmpps_avx512vl(auVar29,auVar154,1);
  bVar27 = (bool)((byte)uVar28 & 1);
  auVar32._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._0_4_;
  bVar27 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar32._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._4_4_;
  bVar27 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar32._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._8_4_;
  bVar27 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar32._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._12_4_;
  auVar30 = vrcp14ps_avx512vl(auVar31);
  auVar155._8_4_ = 0x3f800000;
  auVar155._0_8_ = &DAT_3f8000003f800000;
  auVar155._12_4_ = 0x3f800000;
  auVar29 = vfnmadd213ps_fma(auVar31,auVar30,auVar155);
  auVar41 = vfmadd132ps_fma(auVar29,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar34);
  auVar29 = vfnmadd213ps_fma(auVar34,auVar30,auVar155);
  auVar37 = vfmadd132ps_fma(auVar29,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar32);
  auVar29 = vfnmadd213ps_fma(auVar32,auVar30,auVar155);
  auVar36 = vfmadd132ps_fma(auVar29,auVar30,auVar30);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar21 * 7 + 6);
  auVar29 = vpmovsxwd_avx(auVar29);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar38 = vsubps_avx(auVar29,auVar39);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar21 * 9 + 6);
  auVar29 = vpmovsxwd_avx(auVar30);
  auVar135._0_4_ = auVar41._0_4_ * auVar38._0_4_;
  auVar135._4_4_ = auVar41._4_4_ * auVar38._4_4_;
  auVar135._8_4_ = auVar41._8_4_ * auVar38._8_4_;
  auVar135._12_4_ = auVar41._12_4_ * auVar38._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar39);
  auVar126._0_4_ = auVar41._0_4_ * auVar29._0_4_;
  auVar126._4_4_ = auVar41._4_4_ * auVar29._4_4_;
  auVar126._8_4_ = auVar41._8_4_ * auVar29._8_4_;
  auVar126._12_4_ = auVar41._12_4_ * auVar29._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar30 = vpmovsxwd_avx(auVar38);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar21 * -2 + 6);
  auVar29 = vpmovsxwd_avx(auVar41);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar40);
  auVar156._0_4_ = auVar37._0_4_ * auVar29._0_4_;
  auVar156._4_4_ = auVar37._4_4_ * auVar29._4_4_;
  auVar156._8_4_ = auVar37._8_4_ * auVar29._8_4_;
  auVar156._12_4_ = auVar37._12_4_ * auVar29._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar30);
  auVar29 = vsubps_avx(auVar29,auVar40);
  auVar85._0_4_ = auVar37._0_4_ * auVar29._0_4_;
  auVar85._4_4_ = auVar37._4_4_ * auVar29._4_4_;
  auVar85._8_4_ = auVar37._8_4_ * auVar29._8_4_;
  auVar85._12_4_ = auVar37._12_4_ * auVar29._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar25 + uVar21 + 6);
  auVar29 = vpmovsxwd_avx(auVar37);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar33);
  auVar111._0_4_ = auVar36._0_4_ * auVar29._0_4_;
  auVar111._4_4_ = auVar36._4_4_ * auVar29._4_4_;
  auVar111._8_4_ = auVar36._8_4_ * auVar29._8_4_;
  auVar111._12_4_ = auVar36._12_4_ * auVar29._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar21 * 0x17 + 6);
  auVar29 = vpmovsxwd_avx(auVar39);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar33);
  auVar78._0_4_ = auVar36._0_4_ * auVar29._0_4_;
  auVar78._4_4_ = auVar36._4_4_ * auVar29._4_4_;
  auVar78._8_4_ = auVar36._8_4_ * auVar29._8_4_;
  auVar78._12_4_ = auVar36._12_4_ * auVar29._12_4_;
  auVar29 = vpminsd_avx(auVar135,auVar126);
  auVar30 = vpminsd_avx(auVar156,auVar85);
  auVar29 = vmaxps_avx(auVar29,auVar30);
  auVar30 = vpminsd_avx(auVar111,auVar78);
  uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar36._4_4_ = uVar77;
  auVar36._0_4_ = uVar77;
  auVar36._8_4_ = uVar77;
  auVar36._12_4_ = uVar77;
  auVar30 = vmaxps_avx512vl(auVar30,auVar36);
  auVar29 = vmaxps_avx(auVar29,auVar30);
  auVar40._8_4_ = 0x3f7ffffa;
  auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar40._12_4_ = 0x3f7ffffa;
  local_d8 = vmulps_avx512vl(auVar29,auVar40);
  auVar29 = vpmaxsd_avx(auVar135,auVar126);
  auVar30 = vpmaxsd_avx(auVar156,auVar85);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar30 = vpmaxsd_avx(auVar111,auVar78);
  fVar207 = ray->tfar;
  auVar33._4_4_ = fVar207;
  auVar33._0_4_ = fVar207;
  auVar33._8_4_ = fVar207;
  auVar33._12_4_ = fVar207;
  auVar30 = vminps_avx512vl(auVar30,auVar33);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar42._8_4_ = 0x3f800003;
  auVar42._0_8_ = 0x3f8000033f800003;
  auVar42._12_4_ = 0x3f800003;
  auVar29 = vmulps_avx512vl(auVar29,auVar42);
  auVar30 = vpbroadcastd_avx512vl();
  uVar11 = vcmpps_avx512vl(local_d8,auVar29,2);
  uVar28 = vpcmpgtd_avx512vl(auVar30,_DAT_01ff0cf0);
  uVar28 = ((byte)uVar11 & 0xf) & uVar28;
  bVar27 = (char)uVar28 == '\0';
  local_35d = !bVar27;
  if (bVar27) {
    return local_35d;
  }
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar247 = ZEXT1664(auVar29);
  local_2b0 = prim;
LAB_01b70a83:
  lVar24 = 0;
  for (uVar21 = uVar28; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    lVar24 = lVar24 + 1;
  }
  local_320 = (ulong)*(uint *)(local_2b0 + 2);
  local_2b8 = (ulong)*(uint *)(local_2b0 + lVar24 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[local_320].ptr;
  uVar21 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_2b8);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar29 = *(undefined1 (*) [16])(_Var9 + uVar21 * (long)pvVar8);
  auVar30 = *(undefined1 (*) [16])(_Var9 + (uVar21 + 1) * (long)pvVar8);
  auVar38 = *(undefined1 (*) [16])(_Var9 + (uVar21 + 2) * (long)pvVar8);
  auVar41 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar21 + 3));
  lVar24 = *(long *)&pGVar6[1].time_range.upper;
  auVar37 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * uVar21);
  auVar39 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar21 + 1));
  auVar36 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar21 + 2));
  uVar28 = uVar28 - 1 & uVar28;
  auVar40 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar21 + 3));
  if (uVar28 != 0) {
    uVar25 = uVar28 - 1 & uVar28;
    for (uVar21 = uVar28; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    }
    if (uVar25 != 0) {
      for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar78 = auVar247._0_16_;
  auVar31 = vmulps_avx512vl(auVar40,auVar78);
  auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar36,auVar31);
  auVar79._0_4_ = auVar39._0_4_ + auVar33._0_4_;
  auVar79._4_4_ = auVar39._4_4_ + auVar33._4_4_;
  auVar79._8_4_ = auVar39._8_4_ + auVar33._8_4_;
  auVar79._12_4_ = auVar39._12_4_ + auVar33._12_4_;
  auVar32 = vfmadd231ps_avx512vl(auVar79,auVar37,auVar78);
  auVar58._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar33 = vmulps_avx512vl(auVar40,auVar58._0_16_);
  auVar236._8_4_ = 0x3f000000;
  auVar236._0_8_ = 0x3f0000003f000000;
  auVar236._12_4_ = 0x3f000000;
  auVar33 = vfmadd231ps_fma(auVar33,auVar36,auVar236);
  auVar33 = vfmadd231ps_avx512vl(auVar33,auVar39,auVar58._0_16_);
  auVar42 = vfnmadd231ps_fma(auVar33,auVar37,auVar236);
  auVar34 = vmulps_avx512vl(auVar41,auVar78);
  auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar34);
  auVar221._0_4_ = auVar33._0_4_ + auVar30._0_4_;
  auVar221._4_4_ = auVar33._4_4_ + auVar30._4_4_;
  auVar221._8_4_ = auVar33._8_4_ + auVar30._8_4_;
  auVar221._12_4_ = auVar33._12_4_ + auVar30._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar221,auVar29,auVar78);
  auVar33 = vmulps_avx512vl(auVar41,auVar58._0_16_);
  auVar33 = vfmadd231ps_fma(auVar33,auVar38,auVar236);
  auVar33 = vfmadd231ps_avx512vl(auVar33,auVar30,auVar58._0_16_);
  auVar33 = vfnmadd231ps_fma(auVar33,auVar29,auVar236);
  auVar98._0_4_ = auVar36._0_4_ + auVar31._0_4_;
  auVar98._4_4_ = auVar36._4_4_ + auVar31._4_4_;
  auVar98._8_4_ = auVar36._8_4_ + auVar31._8_4_;
  auVar98._12_4_ = auVar36._12_4_ + auVar31._12_4_;
  auVar31 = vfmadd231ps_avx512vl(auVar98,auVar39,auVar58._0_16_);
  auVar31 = vfmadd231ps_avx512vl(auVar31,auVar37,auVar78);
  auVar112._0_4_ = auVar40._0_4_ * 0.5;
  auVar112._4_4_ = auVar40._4_4_ * 0.5;
  auVar112._8_4_ = auVar40._8_4_ * 0.5;
  auVar112._12_4_ = auVar40._12_4_ * 0.5;
  auVar36 = vfmadd231ps_avx512vl(auVar112,auVar58._0_16_,auVar36);
  auVar39 = vfnmadd231ps_fma(auVar36,auVar236,auVar39);
  auVar36 = vfmadd231ps_avx512vl(auVar39,auVar58._0_16_,auVar37);
  auVar172._0_4_ = auVar34._0_4_ + auVar38._0_4_;
  auVar172._4_4_ = auVar34._4_4_ + auVar38._4_4_;
  auVar172._8_4_ = auVar34._8_4_ + auVar38._8_4_;
  auVar172._12_4_ = auVar34._12_4_ + auVar38._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar172,auVar30,auVar58._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar29,auVar78);
  auVar157._0_4_ = auVar41._0_4_ * 0.5;
  auVar157._4_4_ = auVar41._4_4_ * 0.5;
  auVar157._8_4_ = auVar41._8_4_ * 0.5;
  auVar157._12_4_ = auVar41._12_4_ * 0.5;
  auVar38 = vfmadd231ps_avx512vl(auVar157,auVar58._0_16_,auVar38);
  auVar30 = vfnmadd231ps_fma(auVar38,auVar236,auVar30);
  auVar39 = vfmadd231ps_avx512vl(auVar30,auVar58._0_16_,auVar29);
  auVar29 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar30 = vshufps_avx(auVar35,auVar35,0xc9);
  fVar204 = auVar42._0_4_;
  auVar136._0_4_ = fVar204 * auVar30._0_4_;
  fVar205 = auVar42._4_4_;
  auVar136._4_4_ = fVar205 * auVar30._4_4_;
  fVar206 = auVar42._8_4_;
  auVar136._8_4_ = fVar206 * auVar30._8_4_;
  fVar96 = auVar42._12_4_;
  auVar136._12_4_ = fVar96 * auVar30._12_4_;
  auVar30 = vfmsub231ps_fma(auVar136,auVar29,auVar35);
  auVar38 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar137._0_4_ = fVar204 * auVar30._0_4_;
  auVar137._4_4_ = fVar205 * auVar30._4_4_;
  auVar137._8_4_ = fVar206 * auVar30._8_4_;
  auVar137._12_4_ = fVar96 * auVar30._12_4_;
  auVar29 = vfmsub231ps_fma(auVar137,auVar29,auVar33);
  auVar41 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar29 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar30 = vshufps_avx(auVar37,auVar37,0xc9);
  fVar109 = auVar36._0_4_;
  auVar127._0_4_ = fVar109 * auVar30._0_4_;
  fVar122 = auVar36._4_4_;
  auVar127._4_4_ = fVar122 * auVar30._4_4_;
  fVar123 = auVar36._8_4_;
  auVar127._8_4_ = fVar123 * auVar30._8_4_;
  fVar124 = auVar36._12_4_;
  auVar127._12_4_ = fVar124 * auVar30._12_4_;
  auVar30 = vfmsub231ps_fma(auVar127,auVar29,auVar37);
  auVar37 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar173._0_4_ = auVar30._0_4_ * fVar109;
  auVar173._4_4_ = auVar30._4_4_ * fVar122;
  auVar173._8_4_ = auVar30._8_4_ * fVar123;
  auVar173._12_4_ = auVar30._12_4_ * fVar124;
  auVar29 = vfmsub231ps_fma(auVar173,auVar29,auVar39);
  auVar39 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar29 = vdpps_avx(auVar38,auVar38,0x7f);
  fVar191 = auVar29._0_4_;
  auVar58._16_16_ = auVar61._16_16_;
  auVar44._4_28_ = auVar58._4_28_;
  auVar44._0_4_ = fVar191;
  auVar30 = vrsqrt14ss_avx512f(auVar58._0_16_,auVar44._0_16_);
  auVar40 = vmulss_avx512f(auVar30,ZEXT416(0x3fc00000));
  fVar207 = auVar30._0_4_;
  fVar207 = auVar40._0_4_ + fVar191 * -0.5 * fVar207 * fVar207 * fVar207;
  auVar30 = vdpps_avx(auVar38,auVar41,0x7f);
  fVar220 = fVar207 * auVar38._0_4_;
  fVar228 = fVar207 * auVar38._4_4_;
  fVar229 = fVar207 * auVar38._8_4_;
  fVar230 = fVar207 * auVar38._12_4_;
  auVar184._0_4_ = auVar41._0_4_ * fVar191;
  auVar184._4_4_ = auVar41._4_4_ * fVar191;
  auVar184._8_4_ = auVar41._8_4_ * fVar191;
  auVar184._12_4_ = auVar41._12_4_ * fVar191;
  fVar191 = auVar30._0_4_;
  auVar149._0_4_ = fVar191 * auVar38._0_4_;
  auVar149._4_4_ = fVar191 * auVar38._4_4_;
  auVar149._8_4_ = fVar191 * auVar38._8_4_;
  auVar149._12_4_ = fVar191 * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar184,auVar149);
  auVar30 = vrcp14ss_avx512f(auVar58._0_16_,auVar44._0_16_);
  auVar29 = vfnmadd213ss_fma(auVar29,auVar30,SUB6416(ZEXT464(0x40000000),0));
  fVar202 = auVar30._0_4_ * auVar29._0_4_;
  auVar29 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar203 = auVar29._0_4_;
  auVar59._16_16_ = auVar61._16_16_;
  auVar59._0_16_ = auVar58._0_16_;
  auVar60._4_28_ = auVar59._4_28_;
  auVar60._0_4_ = fVar203;
  auVar30 = vrsqrt14ss_avx512f(auVar58._0_16_,auVar60._0_16_);
  auVar41 = vmulss_avx512f(auVar30,ZEXT416(0x3fc00000));
  fVar191 = auVar30._0_4_;
  fVar191 = auVar41._0_4_ + fVar203 * -0.5 * fVar191 * fVar191 * fVar191;
  auVar30 = vdpps_avx(auVar37,auVar39,0x7f);
  fVar208 = fVar191 * auVar37._0_4_;
  fVar217 = fVar191 * auVar37._4_4_;
  fVar218 = fVar191 * auVar37._8_4_;
  fVar219 = fVar191 * auVar37._12_4_;
  auVar138._0_4_ = fVar203 * auVar39._0_4_;
  auVar138._4_4_ = fVar203 * auVar39._4_4_;
  auVar138._8_4_ = fVar203 * auVar39._8_4_;
  auVar138._12_4_ = fVar203 * auVar39._12_4_;
  fVar203 = auVar30._0_4_;
  auVar128._0_4_ = fVar203 * auVar37._0_4_;
  auVar128._4_4_ = fVar203 * auVar37._4_4_;
  auVar128._8_4_ = fVar203 * auVar37._8_4_;
  auVar128._12_4_ = fVar203 * auVar37._12_4_;
  auVar41 = vsubps_avx(auVar138,auVar128);
  auVar30 = vrcp14ss_avx512f(auVar58._0_16_,auVar60._0_16_);
  auVar29 = vfnmadd213ss_fma(auVar29,auVar30,SUB6416(ZEXT464(0x40000000),0));
  fVar203 = auVar30._0_4_ * auVar29._0_4_;
  auVar29 = vshufps_avx(auVar32,auVar32,0xff);
  auVar158._0_4_ = fVar220 * auVar29._0_4_;
  auVar158._4_4_ = fVar228 * auVar29._4_4_;
  auVar158._8_4_ = fVar229 * auVar29._8_4_;
  auVar158._12_4_ = fVar230 * auVar29._12_4_;
  local_208 = vsubps_avx(auVar32,auVar158);
  auVar30 = vshufps_avx(auVar42,auVar42,0xff);
  auVar139._0_4_ = auVar30._0_4_ * fVar220 + auVar29._0_4_ * fVar207 * auVar38._0_4_ * fVar202;
  auVar139._4_4_ = auVar30._4_4_ * fVar228 + auVar29._4_4_ * fVar207 * auVar38._4_4_ * fVar202;
  auVar139._8_4_ = auVar30._8_4_ * fVar229 + auVar29._8_4_ * fVar207 * auVar38._8_4_ * fVar202;
  auVar139._12_4_ = auVar30._12_4_ * fVar230 + auVar29._12_4_ * fVar207 * auVar38._12_4_ * fVar202;
  auVar38 = vsubps_avx(auVar42,auVar139);
  local_218._0_4_ = auVar32._0_4_ + auVar158._0_4_;
  local_218._4_4_ = auVar32._4_4_ + auVar158._4_4_;
  fStack_210 = auVar32._8_4_ + auVar158._8_4_;
  fStack_20c = auVar32._12_4_ + auVar158._12_4_;
  auVar29 = vshufps_avx(auVar31,auVar31,0xff);
  auVar140._0_4_ = fVar208 * auVar29._0_4_;
  auVar140._4_4_ = fVar217 * auVar29._4_4_;
  auVar140._8_4_ = fVar218 * auVar29._8_4_;
  auVar140._12_4_ = fVar219 * auVar29._12_4_;
  local_228 = vsubps_avx(auVar31,auVar140);
  auVar30 = vshufps_avx(auVar36,auVar36,0xff);
  auVar86._0_4_ = fVar208 * auVar30._0_4_ + auVar29._0_4_ * fVar191 * auVar41._0_4_ * fVar203;
  auVar86._4_4_ = fVar217 * auVar30._4_4_ + auVar29._4_4_ * fVar191 * auVar41._4_4_ * fVar203;
  auVar86._8_4_ = fVar218 * auVar30._8_4_ + auVar29._8_4_ * fVar191 * auVar41._8_4_ * fVar203;
  auVar86._12_4_ = fVar219 * auVar30._12_4_ + auVar29._12_4_ * fVar191 * auVar41._12_4_ * fVar203;
  auVar29 = vsubps_avx(auVar36,auVar86);
  _local_238 = vaddps_avx512vl(auVar31,auVar140);
  auVar99._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar99._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar99._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar99._12_4_ = auVar38._12_4_ * 0.33333334;
  local_248 = vaddps_avx512vl(local_208,auVar99);
  auVar100._0_4_ = auVar29._0_4_ * 0.33333334;
  auVar100._4_4_ = auVar29._4_4_ * 0.33333334;
  auVar100._8_4_ = auVar29._8_4_ * 0.33333334;
  auVar100._12_4_ = auVar29._12_4_ * 0.33333334;
  local_258 = vsubps_avx512vl(local_228,auVar100);
  auVar80._0_4_ = (fVar204 + auVar139._0_4_) * 0.33333334;
  auVar80._4_4_ = (fVar205 + auVar139._4_4_) * 0.33333334;
  auVar80._8_4_ = (fVar206 + auVar139._8_4_) * 0.33333334;
  auVar80._12_4_ = (fVar96 + auVar139._12_4_) * 0.33333334;
  _local_268 = vaddps_avx512vl(_local_218,auVar80);
  auVar81._0_4_ = (fVar109 + auVar86._0_4_) * 0.33333334;
  auVar81._4_4_ = (fVar122 + auVar86._4_4_) * 0.33333334;
  auVar81._8_4_ = (fVar123 + auVar86._8_4_) * 0.33333334;
  auVar81._12_4_ = (fVar124 + auVar86._12_4_) * 0.33333334;
  _local_278 = vsubps_avx512vl(_local_238,auVar81);
  aVar1 = (ray->org).field_0;
  auVar30 = vsubps_avx(local_208,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar87._4_4_ = uVar77;
  auVar87._0_4_ = uVar77;
  auVar87._8_4_ = uVar77;
  auVar87._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar207 = (pre->ray_space).vz.field_0.m128[0];
  fVar191 = (pre->ray_space).vz.field_0.m128[1];
  fVar202 = (pre->ray_space).vz.field_0.m128[2];
  fVar203 = (pre->ray_space).vz.field_0.m128[3];
  auVar82._0_4_ = fVar207 * auVar30._0_4_;
  auVar82._4_4_ = fVar191 * auVar30._4_4_;
  auVar82._8_4_ = fVar202 * auVar30._8_4_;
  auVar82._12_4_ = fVar203 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar3,auVar29);
  auVar37 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar87);
  auVar30 = vsubps_avx512vl(local_248,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar101._4_4_ = uVar77;
  auVar101._0_4_ = uVar77;
  auVar101._8_4_ = uVar77;
  auVar101._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar88._0_4_ = fVar207 * auVar30._0_4_;
  auVar88._4_4_ = fVar191 * auVar30._4_4_;
  auVar88._8_4_ = fVar202 * auVar30._8_4_;
  auVar88._12_4_ = fVar203 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar3,auVar29);
  auVar39 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar101);
  auVar30 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar159._4_4_ = uVar77;
  auVar159._0_4_ = uVar77;
  auVar159._8_4_ = uVar77;
  auVar159._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar102._0_4_ = fVar207 * auVar30._0_4_;
  auVar102._4_4_ = fVar191 * auVar30._4_4_;
  auVar102._8_4_ = fVar202 * auVar30._8_4_;
  auVar102._12_4_ = fVar203 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar3,auVar29);
  auVar36 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar159);
  auVar30 = vsubps_avx(local_228,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar174._4_4_ = uVar77;
  auVar174._0_4_ = uVar77;
  auVar174._8_4_ = uVar77;
  auVar174._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar160._0_4_ = fVar207 * auVar30._0_4_;
  auVar160._4_4_ = fVar191 * auVar30._4_4_;
  auVar160._8_4_ = fVar202 * auVar30._8_4_;
  auVar160._12_4_ = fVar203 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar3,auVar29);
  auVar40 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar174);
  auVar30 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar185._4_4_ = uVar77;
  auVar185._0_4_ = uVar77;
  auVar185._8_4_ = uVar77;
  auVar185._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar175._0_4_ = auVar30._0_4_ * fVar207;
  auVar175._4_4_ = auVar30._4_4_ * fVar191;
  auVar175._8_4_ = auVar30._8_4_ * fVar202;
  auVar175._12_4_ = auVar30._12_4_ * fVar203;
  auVar29 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar3,auVar29);
  auVar33 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar185);
  auVar30 = vsubps_avx512vl(_local_268,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar192._4_4_ = uVar77;
  auVar192._0_4_ = uVar77;
  auVar192._8_4_ = uVar77;
  auVar192._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar186._0_4_ = auVar30._0_4_ * fVar207;
  auVar186._4_4_ = auVar30._4_4_ * fVar191;
  auVar186._8_4_ = auVar30._8_4_ * fVar202;
  auVar186._12_4_ = auVar30._12_4_ * fVar203;
  auVar29 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar29);
  auVar42 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar192);
  auVar30 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar209._4_4_ = uVar77;
  auVar209._0_4_ = uVar77;
  auVar209._8_4_ = uVar77;
  auVar209._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar193._0_4_ = auVar30._0_4_ * fVar207;
  auVar193._4_4_ = auVar30._4_4_ * fVar191;
  auVar193._8_4_ = auVar30._8_4_ * fVar202;
  auVar193._12_4_ = auVar30._12_4_ * fVar203;
  auVar29 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar3,auVar29);
  auVar31 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar209);
  auVar30 = vsubps_avx512vl(_local_238,(undefined1  [16])aVar1);
  uVar77 = auVar30._0_4_;
  auVar210._4_4_ = uVar77;
  auVar210._0_4_ = uVar77;
  auVar210._8_4_ = uVar77;
  auVar210._12_4_ = uVar77;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar129._0_4_ = fVar207 * auVar30._0_4_;
  auVar129._4_4_ = fVar191 * auVar30._4_4_;
  auVar129._8_4_ = fVar202 * auVar30._8_4_;
  auVar129._12_4_ = fVar203 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar3,auVar29);
  auVar32 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar210);
  local_338 = vmovlhps_avx512f(auVar37,auVar33);
  auVar246 = ZEXT1664(local_338);
  local_2c8 = vmovlhps_avx(auVar39,auVar42);
  local_2d8 = vmovlhps_avx512f(auVar36,auVar31);
  _local_1e8 = vmovlhps_avx512f(auVar40,auVar32);
  auVar29 = vminps_avx512vl(local_338,local_2c8);
  auVar38 = vmaxps_avx512vl(local_338,local_2c8);
  auVar30 = vminps_avx512vl(local_2d8,_local_1e8);
  auVar30 = vminps_avx(auVar29,auVar30);
  auVar29 = vmaxps_avx512vl(local_2d8,_local_1e8);
  auVar29 = vmaxps_avx(auVar38,auVar29);
  auVar38 = vshufpd_avx(auVar30,auVar30,3);
  auVar41 = vshufpd_avx(auVar29,auVar29,3);
  auVar30 = vminps_avx(auVar30,auVar38);
  auVar29 = vmaxps_avx(auVar29,auVar41);
  auVar30 = vandps_avx512vl(auVar30,auVar245._0_16_);
  auVar29 = vandps_avx512vl(auVar29,auVar245._0_16_);
  auVar29 = vmaxps_avx(auVar30,auVar29);
  auVar30 = vmovshdup_avx(auVar29);
  auVar29 = vmaxss_avx(auVar30,auVar29);
  local_168._8_8_ = auVar37._0_8_;
  local_168._0_8_ = auVar37._0_8_;
  local_178._8_8_ = auVar39._0_8_;
  local_178._0_8_ = auVar39._0_8_;
  local_188 = vmovddup_avx512vl(auVar36);
  local_198._0_8_ = auVar40._0_8_;
  local_198._8_8_ = local_198._0_8_;
  register0x00001348 = auVar33._0_8_;
  local_1a8 = auVar33._0_8_;
  register0x00001408 = auVar42._0_8_;
  local_1b8 = auVar42._0_8_;
  register0x00001448 = auVar31._0_8_;
  local_1c8 = auVar31._0_8_;
  register0x00001488 = auVar32._0_8_;
  local_1d8 = auVar32._0_8_;
  local_1f8 = ZEXT416((uint)(auVar29._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_1f8);
  auVar29 = vxorps_avx512vl(local_78._0_16_,auVar78);
  local_98 = vbroadcastss_avx512vl(auVar29);
  local_308 = vsubps_avx512vl(local_2c8,local_338);
  local_318 = vsubps_avx512vl(local_2d8,local_2c8);
  local_c8 = vsubps_avx512vl(_local_1e8,local_2d8);
  local_e8 = vsubps_avx(_local_218,local_208);
  local_f8 = vsubps_avx512vl(_local_268,local_248);
  local_108 = vsubps_avx512vl(_local_278,local_258);
  _local_118 = vsubps_avx512vl(_local_238,local_228);
  bVar27 = false;
  auVar29 = ZEXT816(0x3f80000000000000);
  auVar242 = ZEXT1664(auVar29);
  uVar21 = 0;
  do {
    auVar33 = auVar242._0_16_;
    auVar30 = vshufps_avx(auVar33,auVar33,0x50);
    auVar231._8_4_ = 0x3f800000;
    auVar231._0_8_ = &DAT_3f8000003f800000;
    auVar231._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._0_16_ = auVar231;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar231,auVar30);
    fVar207 = auVar30._0_4_;
    auVar113._0_4_ = local_1a8._0_4_ * fVar207;
    fVar191 = auVar30._4_4_;
    auVar113._4_4_ = local_1a8._4_4_ * fVar191;
    fVar202 = auVar30._8_4_;
    auVar113._8_4_ = local_1a8._8_4_ * fVar202;
    fVar203 = auVar30._12_4_;
    auVar113._12_4_ = local_1a8._12_4_ * fVar203;
    auVar130._0_4_ = local_1b8._0_4_ * fVar207;
    auVar130._4_4_ = local_1b8._4_4_ * fVar191;
    auVar130._8_4_ = local_1b8._8_4_ * fVar202;
    auVar130._12_4_ = local_1b8._12_4_ * fVar203;
    auVar141._0_4_ = local_1c8._0_4_ * fVar207;
    auVar141._4_4_ = local_1c8._4_4_ * fVar191;
    auVar141._8_4_ = local_1c8._8_4_ * fVar202;
    auVar141._12_4_ = local_1c8._12_4_ * fVar203;
    auVar89._0_4_ = local_1d8._0_4_ * fVar207;
    auVar89._4_4_ = local_1d8._4_4_ * fVar191;
    auVar89._8_4_ = local_1d8._8_4_ * fVar202;
    auVar89._12_4_ = local_1d8._12_4_ * fVar203;
    auVar41 = vfmadd231ps_fma(auVar113,auVar38,local_168);
    auVar37 = vfmadd231ps_fma(auVar130,auVar38,local_178);
    auVar39 = vfmadd231ps_avx512vl(auVar141,auVar38,local_188);
    auVar38 = vfmadd231ps_fma(auVar89,local_198,auVar38);
    auVar30 = vmovshdup_avx(auVar29);
    fVar191 = auVar29._0_4_;
    fVar207 = (auVar30._0_4_ - fVar191) * 0.04761905;
    auVar57._4_4_ = fVar191;
    auVar57._0_4_ = fVar191;
    auVar57._8_4_ = fVar191;
    auVar57._12_4_ = fVar191;
    auVar57._16_4_ = fVar191;
    auVar57._20_4_ = fVar191;
    auVar57._24_4_ = fVar191;
    auVar57._28_4_ = fVar191;
    auVar52._0_8_ = auVar30._0_8_;
    auVar52._8_8_ = auVar52._0_8_;
    auVar52._16_8_ = auVar52._0_8_;
    auVar52._24_8_ = auVar52._0_8_;
    auVar61 = vsubps_avx(auVar52,auVar57);
    uVar77 = auVar41._0_4_;
    auVar63._4_4_ = uVar77;
    auVar63._0_4_ = uVar77;
    auVar63._8_4_ = uVar77;
    auVar63._12_4_ = uVar77;
    auVar63._16_4_ = uVar77;
    auVar63._20_4_ = uVar77;
    auVar63._24_4_ = uVar77;
    auVar63._28_4_ = uVar77;
    auVar53._8_4_ = 1;
    auVar53._0_8_ = 0x100000001;
    auVar53._12_4_ = 1;
    auVar53._16_4_ = 1;
    auVar53._20_4_ = 1;
    auVar53._24_4_ = 1;
    auVar53._28_4_ = 1;
    auVar59 = ZEXT1632(auVar41);
    auVar58 = vpermps_avx2(auVar53,auVar59);
    auVar44 = vbroadcastss_avx512vl(auVar37);
    auVar60 = ZEXT1632(auVar37);
    auVar45 = vpermps_avx512vl(auVar53,auVar60);
    auVar46 = vbroadcastss_avx512vl(auVar39);
    auVar54 = ZEXT1632(auVar39);
    auVar47 = vpermps_avx512vl(auVar53,auVar54);
    auVar48 = vbroadcastss_avx512vl(auVar38);
    auVar56 = ZEXT1632(auVar38);
    auVar49 = vpermps_avx512vl(auVar53,auVar56);
    auVar64._4_4_ = fVar207;
    auVar64._0_4_ = fVar207;
    auVar64._8_4_ = fVar207;
    auVar64._12_4_ = fVar207;
    auVar64._16_4_ = fVar207;
    auVar64._20_4_ = fVar207;
    auVar64._24_4_ = fVar207;
    auVar64._28_4_ = fVar207;
    auVar55._8_4_ = 2;
    auVar55._0_8_ = 0x200000002;
    auVar55._12_4_ = 2;
    auVar55._16_4_ = 2;
    auVar55._20_4_ = 2;
    auVar55._24_4_ = 2;
    auVar55._28_4_ = 2;
    auVar50 = vpermps_avx512vl(auVar55,auVar59);
    auVar51 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar52 = vpermps_avx512vl(auVar51,auVar59);
    auVar59 = vpermps_avx2(auVar55,auVar60);
    auVar53 = vpermps_avx512vl(auVar51,auVar60);
    auVar60 = vpermps_avx2(auVar55,auVar54);
    auVar54 = vpermps_avx512vl(auVar51,auVar54);
    auVar55 = vpermps_avx512vl(auVar55,auVar56);
    auVar51 = vpermps_avx512vl(auVar51,auVar56);
    auVar30 = vfmadd132ps_fma(auVar61,auVar57,_DAT_02020f20);
    auVar61 = vsubps_avx(auVar119,ZEXT1632(auVar30));
    auVar56 = vmulps_avx512vl(auVar44,ZEXT1632(auVar30));
    auVar62 = ZEXT1632(auVar30);
    auVar57 = vmulps_avx512vl(auVar45,auVar62);
    auVar38 = vfmadd231ps_fma(auVar56,auVar61,auVar63);
    auVar41 = vfmadd231ps_fma(auVar57,auVar61,auVar58);
    auVar56 = vmulps_avx512vl(auVar46,auVar62);
    auVar57 = vmulps_avx512vl(auVar47,auVar62);
    auVar44 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar44);
    auVar56 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar45);
    auVar45 = vmulps_avx512vl(auVar48,auVar62);
    auVar63 = ZEXT1632(auVar30);
    auVar49 = vmulps_avx512vl(auVar49,auVar63);
    auVar57 = vfmadd231ps_avx512vl(auVar45,auVar61,auVar46);
    auVar49 = vfmadd231ps_avx512vl(auVar49,auVar61,auVar47);
    fVar202 = auVar30._0_4_;
    fVar203 = auVar30._4_4_;
    auVar45._4_4_ = fVar203 * auVar44._4_4_;
    auVar45._0_4_ = fVar202 * auVar44._0_4_;
    fVar204 = auVar30._8_4_;
    auVar45._8_4_ = fVar204 * auVar44._8_4_;
    fVar205 = auVar30._12_4_;
    auVar45._12_4_ = fVar205 * auVar44._12_4_;
    auVar45._16_4_ = auVar44._16_4_ * 0.0;
    auVar45._20_4_ = auVar44._20_4_ * 0.0;
    auVar45._24_4_ = auVar44._24_4_ * 0.0;
    auVar45._28_4_ = fVar191;
    auVar46._4_4_ = fVar203 * auVar56._4_4_;
    auVar46._0_4_ = fVar202 * auVar56._0_4_;
    auVar46._8_4_ = fVar204 * auVar56._8_4_;
    auVar46._12_4_ = fVar205 * auVar56._12_4_;
    auVar46._16_4_ = auVar56._16_4_ * 0.0;
    auVar46._20_4_ = auVar56._20_4_ * 0.0;
    auVar46._24_4_ = auVar56._24_4_ * 0.0;
    auVar46._28_4_ = auVar58._28_4_;
    auVar38 = vfmadd231ps_fma(auVar45,auVar61,ZEXT1632(auVar38));
    auVar41 = vfmadd231ps_fma(auVar46,auVar61,ZEXT1632(auVar41));
    auVar62._0_4_ = fVar202 * auVar57._0_4_;
    auVar62._4_4_ = fVar203 * auVar57._4_4_;
    auVar62._8_4_ = fVar204 * auVar57._8_4_;
    auVar62._12_4_ = fVar205 * auVar57._12_4_;
    auVar62._16_4_ = auVar57._16_4_ * 0.0;
    auVar62._20_4_ = auVar57._20_4_ * 0.0;
    auVar62._24_4_ = auVar57._24_4_ * 0.0;
    auVar62._28_4_ = 0;
    auVar47._4_4_ = fVar203 * auVar49._4_4_;
    auVar47._0_4_ = fVar202 * auVar49._0_4_;
    auVar47._8_4_ = fVar204 * auVar49._8_4_;
    auVar47._12_4_ = fVar205 * auVar49._12_4_;
    auVar47._16_4_ = auVar49._16_4_ * 0.0;
    auVar47._20_4_ = auVar49._20_4_ * 0.0;
    auVar47._24_4_ = auVar49._24_4_ * 0.0;
    auVar47._28_4_ = auVar57._28_4_;
    auVar37 = vfmadd231ps_fma(auVar62,auVar61,auVar44);
    auVar39 = vfmadd231ps_fma(auVar47,auVar61,auVar56);
    auVar49._28_4_ = auVar56._28_4_;
    auVar49._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * auVar39._12_4_,
                            CONCAT48(fVar204 * auVar39._8_4_,
                                     CONCAT44(fVar203 * auVar39._4_4_,fVar202 * auVar39._0_4_))));
    auVar36 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar205 * auVar37._12_4_,
                                                 CONCAT48(fVar204 * auVar37._8_4_,
                                                          CONCAT44(fVar203 * auVar37._4_4_,
                                                                   fVar202 * auVar37._0_4_)))),
                              auVar61,ZEXT1632(auVar38));
    auVar40 = vfmadd231ps_fma(auVar49,auVar61,ZEXT1632(auVar41));
    auVar58 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar38));
    auVar44 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar41));
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar58 = vmulps_avx512vl(auVar58,auVar45);
    auVar44 = vmulps_avx512vl(auVar44,auVar45);
    auVar56._0_4_ = fVar207 * auVar58._0_4_;
    auVar56._4_4_ = fVar207 * auVar58._4_4_;
    auVar56._8_4_ = fVar207 * auVar58._8_4_;
    auVar56._12_4_ = fVar207 * auVar58._12_4_;
    auVar56._16_4_ = fVar207 * auVar58._16_4_;
    auVar56._20_4_ = fVar207 * auVar58._20_4_;
    auVar56._24_4_ = fVar207 * auVar58._24_4_;
    auVar56._28_4_ = 0;
    auVar58 = vmulps_avx512vl(auVar64,auVar44);
    auVar37 = vxorps_avx512vl(auVar48._0_16_,auVar48._0_16_);
    auVar44 = vpermt2ps_avx512vl(ZEXT1632(auVar36),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar46 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar95._0_4_ = auVar56._0_4_ + auVar36._0_4_;
    auVar95._4_4_ = auVar56._4_4_ + auVar36._4_4_;
    auVar95._8_4_ = auVar56._8_4_ + auVar36._8_4_;
    auVar95._12_4_ = auVar56._12_4_ + auVar36._12_4_;
    auVar95._16_4_ = auVar56._16_4_ + 0.0;
    auVar95._20_4_ = auVar56._20_4_ + 0.0;
    auVar95._24_4_ = auVar56._24_4_ + 0.0;
    auVar95._28_4_ = 0;
    auVar57 = ZEXT1632(auVar37);
    auVar47 = vpermt2ps_avx512vl(auVar56,_DAT_0205fd20,auVar57);
    auVar49 = vaddps_avx512vl(ZEXT1632(auVar40),auVar58);
    auVar48 = vpermt2ps_avx512vl(auVar58,_DAT_0205fd20,auVar57);
    auVar58 = vsubps_avx(auVar44,auVar47);
    auVar47 = vsubps_avx512vl(auVar46,auVar48);
    auVar48 = vmulps_avx512vl(auVar59,auVar63);
    auVar56 = vmulps_avx512vl(auVar53,auVar63);
    auVar48 = vfmadd231ps_avx512vl(auVar48,auVar61,auVar50);
    auVar50 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar52);
    auVar52 = vmulps_avx512vl(auVar60,auVar63);
    auVar56 = vmulps_avx512vl(auVar54,auVar63);
    auVar59 = vfmadd231ps_avx512vl(auVar52,auVar61,auVar59);
    auVar52 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar53);
    auVar53 = vmulps_avx512vl(auVar55,auVar63);
    auVar51 = vmulps_avx512vl(auVar51,auVar63);
    auVar38 = vfmadd231ps_fma(auVar53,auVar61,auVar60);
    auVar41 = vfmadd231ps_fma(auVar51,auVar61,auVar54);
    auVar51 = vmulps_avx512vl(auVar63,auVar59);
    auVar53 = vmulps_avx512vl(ZEXT1632(auVar30),auVar52);
    auVar51 = vfmadd231ps_avx512vl(auVar51,auVar61,auVar48);
    auVar53 = vfmadd231ps_avx512vl(auVar53,auVar61,auVar50);
    auVar59 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar205 * auVar38._12_4_,
                                            CONCAT48(fVar204 * auVar38._8_4_,
                                                     CONCAT44(fVar203 * auVar38._4_4_,
                                                              fVar202 * auVar38._0_4_)))),auVar61,
                         auVar59);
    auVar52 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar205 * auVar41._12_4_,
                                            CONCAT48(fVar204 * auVar41._8_4_,
                                                     CONCAT44(fVar203 * auVar41._4_4_,
                                                              fVar202 * auVar41._0_4_)))),auVar61,
                         auVar52);
    auVar48._4_4_ = fVar203 * auVar59._4_4_;
    auVar48._0_4_ = fVar202 * auVar59._0_4_;
    auVar48._8_4_ = fVar204 * auVar59._8_4_;
    auVar48._12_4_ = fVar205 * auVar59._12_4_;
    auVar48._16_4_ = auVar59._16_4_ * 0.0;
    auVar48._20_4_ = auVar59._20_4_ * 0.0;
    auVar48._24_4_ = auVar59._24_4_ * 0.0;
    auVar48._28_4_ = auVar54._28_4_;
    auVar50._4_4_ = fVar203 * auVar52._4_4_;
    auVar50._0_4_ = fVar202 * auVar52._0_4_;
    auVar50._8_4_ = fVar204 * auVar52._8_4_;
    auVar50._12_4_ = fVar205 * auVar52._12_4_;
    auVar50._16_4_ = auVar52._16_4_ * 0.0;
    auVar50._20_4_ = auVar52._20_4_ * 0.0;
    auVar50._24_4_ = auVar52._24_4_ * 0.0;
    auVar50._28_4_ = auVar60._28_4_;
    auVar60 = vfmadd231ps_avx512vl(auVar48,auVar61,auVar51);
    auVar48 = vfmadd231ps_avx512vl(auVar50,auVar53,auVar61);
    auVar61 = vsubps_avx512vl(auVar59,auVar51);
    auVar59 = vsubps_avx512vl(auVar52,auVar53);
    auVar61 = vmulps_avx512vl(auVar61,auVar45);
    auVar59 = vmulps_avx512vl(auVar59,auVar45);
    fVar191 = fVar207 * auVar61._0_4_;
    fVar202 = fVar207 * auVar61._4_4_;
    auVar51._4_4_ = fVar202;
    auVar51._0_4_ = fVar191;
    fVar203 = fVar207 * auVar61._8_4_;
    auVar51._8_4_ = fVar203;
    fVar204 = fVar207 * auVar61._12_4_;
    auVar51._12_4_ = fVar204;
    fVar205 = fVar207 * auVar61._16_4_;
    auVar51._16_4_ = fVar205;
    fVar206 = fVar207 * auVar61._20_4_;
    auVar51._20_4_ = fVar206;
    fVar207 = fVar207 * auVar61._24_4_;
    auVar51._24_4_ = fVar207;
    auVar51._28_4_ = auVar61._28_4_;
    auVar59 = vmulps_avx512vl(auVar64,auVar59);
    auVar45 = vpermt2ps_avx512vl(auVar60,_DAT_0205fd20,auVar57);
    auVar50 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar57);
    auVar190._0_4_ = auVar60._0_4_ + fVar191;
    auVar190._4_4_ = auVar60._4_4_ + fVar202;
    auVar190._8_4_ = auVar60._8_4_ + fVar203;
    auVar190._12_4_ = auVar60._12_4_ + fVar204;
    auVar190._16_4_ = auVar60._16_4_ + fVar205;
    auVar190._20_4_ = auVar60._20_4_ + fVar206;
    auVar190._24_4_ = auVar60._24_4_ + fVar207;
    auVar190._28_4_ = auVar60._28_4_ + auVar61._28_4_;
    auVar61 = vpermt2ps_avx512vl(auVar51,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar51 = vaddps_avx512vl(auVar48,auVar59);
    auVar59 = vpermt2ps_avx512vl(auVar59,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar61 = vsubps_avx(auVar45,auVar61);
    auVar59 = vsubps_avx512vl(auVar50,auVar59);
    auVar119 = ZEXT1632(auVar36);
    auVar52 = vsubps_avx512vl(auVar60,auVar119);
    auVar120 = ZEXT1632(auVar40);
    auVar53 = vsubps_avx512vl(auVar48,auVar120);
    auVar54 = vsubps_avx512vl(auVar45,auVar44);
    auVar52 = vaddps_avx512vl(auVar52,auVar54);
    auVar54 = vsubps_avx512vl(auVar50,auVar46);
    auVar53 = vaddps_avx512vl(auVar53,auVar54);
    auVar54 = vmulps_avx512vl(auVar120,auVar52);
    auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar119,auVar53);
    auVar55 = vmulps_avx512vl(auVar49,auVar52);
    auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar95,auVar53);
    auVar56 = vmulps_avx512vl(auVar47,auVar52);
    auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar58,auVar53);
    auVar57 = vmulps_avx512vl(auVar46,auVar52);
    auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar44,auVar53);
    auVar62 = vmulps_avx512vl(auVar48,auVar52);
    auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar60,auVar53);
    auVar63 = vmulps_avx512vl(auVar51,auVar52);
    auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar190,auVar53);
    auVar64 = vmulps_avx512vl(auVar59,auVar52);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar61,auVar53);
    auVar52 = vmulps_avx512vl(auVar50,auVar52);
    auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar45,auVar53);
    auVar53 = vminps_avx512vl(auVar54,auVar55);
    auVar54 = vmaxps_avx512vl(auVar54,auVar55);
    auVar55 = vminps_avx512vl(auVar56,auVar57);
    auVar53 = vminps_avx512vl(auVar53,auVar55);
    auVar55 = vmaxps_avx512vl(auVar56,auVar57);
    auVar54 = vmaxps_avx512vl(auVar54,auVar55);
    auVar55 = vminps_avx512vl(auVar62,auVar63);
    auVar56 = vmaxps_avx512vl(auVar62,auVar63);
    auVar57 = vminps_avx512vl(auVar64,auVar52);
    auVar55 = vminps_avx512vl(auVar55,auVar57);
    auVar53 = vminps_avx512vl(auVar53,auVar55);
    auVar52 = vmaxps_avx512vl(auVar64,auVar52);
    auVar52 = vmaxps_avx512vl(auVar56,auVar52);
    auVar52 = vmaxps_avx512vl(auVar54,auVar52);
    uVar11 = vcmpps_avx512vl(auVar53,local_78,2);
    uVar12 = vcmpps_avx512vl(auVar52,local_98,5);
    uVar26 = 0;
    bVar19 = (byte)uVar11 & (byte)uVar12 & 0x7f;
    if (bVar19 != 0) {
      auVar52 = vsubps_avx512vl(auVar44,auVar119);
      auVar53 = vsubps_avx512vl(auVar46,auVar120);
      auVar54 = vsubps_avx512vl(auVar45,auVar60);
      auVar52 = vaddps_avx512vl(auVar52,auVar54);
      auVar54 = vsubps_avx512vl(auVar50,auVar48);
      auVar53 = vaddps_avx512vl(auVar53,auVar54);
      auVar54 = vmulps_avx512vl(auVar120,auVar52);
      auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar53,auVar119);
      auVar49 = vmulps_avx512vl(auVar49,auVar52);
      auVar49 = vfnmadd213ps_avx512vl(auVar95,auVar53,auVar49);
      auVar47 = vmulps_avx512vl(auVar47,auVar52);
      auVar47 = vfnmadd213ps_avx512vl(auVar58,auVar53,auVar47);
      auVar58 = vmulps_avx512vl(auVar46,auVar52);
      auVar46 = vfnmadd231ps_avx512vl(auVar58,auVar53,auVar44);
      auVar58 = vmulps_avx512vl(auVar48,auVar52);
      auVar48 = vfnmadd231ps_avx512vl(auVar58,auVar53,auVar60);
      auVar58 = vmulps_avx512vl(auVar51,auVar52);
      auVar51 = vfnmadd213ps_avx512vl(auVar190,auVar53,auVar58);
      auVar58 = vmulps_avx512vl(auVar59,auVar52);
      auVar55 = vfnmadd213ps_avx512vl(auVar61,auVar53,auVar58);
      auVar61 = vmulps_avx512vl(auVar50,auVar52);
      auVar50 = vfnmadd231ps_avx512vl(auVar61,auVar45,auVar53);
      auVar58 = vminps_avx(auVar54,auVar49);
      auVar61 = vmaxps_avx(auVar54,auVar49);
      auVar44 = vminps_avx(auVar47,auVar46);
      auVar44 = vminps_avx(auVar58,auVar44);
      auVar58 = vmaxps_avx(auVar47,auVar46);
      auVar61 = vmaxps_avx(auVar61,auVar58);
      auVar60 = vminps_avx(auVar48,auVar51);
      auVar58 = vmaxps_avx(auVar48,auVar51);
      auVar45 = vminps_avx(auVar55,auVar50);
      auVar60 = vminps_avx(auVar60,auVar45);
      auVar60 = vminps_avx(auVar44,auVar60);
      auVar44 = vmaxps_avx(auVar55,auVar50);
      auVar58 = vmaxps_avx(auVar58,auVar44);
      auVar61 = vmaxps_avx(auVar61,auVar58);
      uVar11 = vcmpps_avx512vl(auVar61,local_98,5);
      uVar12 = vcmpps_avx512vl(auVar60,local_78,2);
      uVar26 = (uint)(bVar19 & (byte)uVar11 & (byte)uVar12);
    }
    if (uVar26 != 0) {
      auStack_158[uVar21] = uVar26;
      uVar11 = vmovlps_avx(auVar29);
      *(undefined8 *)(&uStack_b8 + uVar21 * 2) = uVar11;
      uVar25 = vmovlps_avx(auVar33);
      auStack_58[uVar21] = uVar25;
      uVar21 = (ulong)((int)uVar21 + 1);
    }
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar243 = ZEXT3264(auVar61);
    auVar244 = ZEXT464(0x3f800000);
    auVar29 = vxorps_avx512vl(auVar59._0_16_,auVar59._0_16_);
    in_ZMM16 = ZEXT1664(auVar29);
    auVar248 = ZEXT1664(local_308);
    auVar249 = ZEXT1664(local_318);
    do {
      auVar29 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar30 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar21 == 0) {
        if (bVar27) {
          return local_35d;
        }
        fVar207 = ray->tfar;
        auVar18._4_4_ = fVar207;
        auVar18._0_4_ = fVar207;
        auVar18._8_4_ = fVar207;
        auVar18._12_4_ = fVar207;
        uVar11 = vcmpps_avx512vl(local_d8,auVar18,2);
        uVar26 = (uint)uVar28 & (uint)uVar11;
        uVar28 = (ulong)uVar26;
        local_35d = uVar26 != 0;
        if (!local_35d) {
          return local_35d;
        }
        goto LAB_01b70a83;
      }
      uVar20 = (int)uVar21 - 1;
      uVar22 = (ulong)uVar20;
      uVar26 = (&uStack_b8)[uVar22 * 2];
      fVar207 = afStack_b4[uVar22 * 2];
      uVar5 = auStack_158[uVar22];
      auVar241._8_8_ = 0;
      auVar241._0_8_ = auStack_58[uVar22];
      auVar242 = ZEXT1664(auVar241);
      lVar24 = 0;
      for (uVar25 = (ulong)uVar5; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar23 = uVar5 - 1 & uVar5;
      auStack_158[uVar22] = uVar23;
      if (uVar23 == 0) {
        uVar21 = (ulong)uVar20;
      }
      auVar41 = vpxord_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar38 = vcvtsi2ss_avx512f(auVar41,lVar24);
      auVar37 = vmulss_avx512f(auVar38,SUB6416(ZEXT464(0x3e124925),0));
      lVar24 = lVar24 + 1;
      auVar38 = vpxord_avx512vl(auVar41,auVar41);
      in_ZMM27 = ZEXT1664(auVar38);
      auVar38 = vcvtsi2ss_avx512f(auVar38,lVar24);
      auVar38 = vmulss_avx512f(auVar38,SUB6416(ZEXT464(0x3e124925),0));
      auVar39 = auVar244._0_16_;
      auVar41 = vsubss_avx512f(auVar39,auVar37);
      local_2e8 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar37._0_4_)),ZEXT416(uVar26),auVar41);
      auVar41 = vsubss_avx512f(auVar39,auVar38);
      auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar38._0_4_)),ZEXT416(uVar26),auVar41);
      fVar191 = auVar38._0_4_;
      fVar202 = local_2e8._0_4_;
      fVar207 = fVar191 - fVar202;
      vucomiss_avx512f(ZEXT416((uint)fVar207));
      if (uVar5 == 0 || lVar24 == 0) break;
      in_ZMM27 = ZEXT1664(auVar241);
      auVar41 = vshufps_avx(auVar241,auVar241,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar207));
      uVar26 = (uint)uVar21;
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = &DAT_3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar103,auVar41);
      fVar203 = auVar41._0_4_;
      auVar114._0_4_ = fVar203 * (float)local_1a8._0_4_;
      fVar204 = auVar41._4_4_;
      auVar114._4_4_ = fVar204 * (float)local_1a8._4_4_;
      fVar205 = auVar41._8_4_;
      auVar114._8_4_ = fVar205 * fStack_1a0;
      fVar206 = auVar41._12_4_;
      auVar114._12_4_ = fVar206 * fStack_19c;
      auVar131._0_4_ = fVar203 * (float)local_1b8._0_4_;
      auVar131._4_4_ = fVar204 * (float)local_1b8._4_4_;
      auVar131._8_4_ = fVar205 * fStack_1b0;
      auVar131._12_4_ = fVar206 * fStack_1ac;
      auVar142._0_4_ = fVar203 * (float)local_1c8._0_4_;
      auVar142._4_4_ = fVar204 * (float)local_1c8._4_4_;
      auVar142._8_4_ = fVar205 * fStack_1c0;
      auVar142._12_4_ = fVar206 * fStack_1bc;
      auVar90._0_4_ = fVar203 * (float)local_1d8._0_4_;
      auVar90._4_4_ = fVar204 * (float)local_1d8._4_4_;
      auVar90._8_4_ = fVar205 * fStack_1d0;
      auVar90._12_4_ = fVar206 * fStack_1cc;
      auVar41 = vfmadd231ps_fma(auVar114,auVar37,local_168);
      auVar36 = vfmadd231ps_fma(auVar131,auVar37,local_178);
      auVar40 = vfmadd231ps_fma(auVar142,auVar37,local_188);
      auVar37 = vfmadd231ps_fma(auVar90,auVar37,local_198);
      auVar54._16_16_ = auVar41;
      auVar54._0_16_ = auVar41;
      auVar120._16_16_ = auVar36;
      auVar120._0_16_ = auVar36;
      auVar134._16_16_ = auVar40;
      auVar134._0_16_ = auVar40;
      auVar153._4_4_ = fVar202;
      auVar153._0_4_ = fVar202;
      auVar153._8_4_ = fVar202;
      auVar153._12_4_ = fVar202;
      auVar153._20_4_ = fVar191;
      auVar153._16_4_ = fVar191;
      auVar153._24_4_ = fVar191;
      auVar153._28_4_ = fVar191;
      auVar61 = vsubps_avx(auVar120,auVar54);
      auVar36 = vfmadd213ps_fma(auVar61,auVar153,auVar54);
      auVar61 = vsubps_avx(auVar134,auVar120);
      auVar33 = vfmadd213ps_fma(auVar61,auVar153,auVar120);
      auVar41 = vsubps_avx(auVar37,auVar40);
      auVar121._16_16_ = auVar41;
      auVar121._0_16_ = auVar41;
      auVar41 = vfmadd213ps_fma(auVar121,auVar153,auVar134);
      auVar61 = vsubps_avx(ZEXT1632(auVar33),ZEXT1632(auVar36));
      auVar37 = vfmadd213ps_fma(auVar61,auVar153,ZEXT1632(auVar36));
      auVar61 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar33));
      auVar41 = vfmadd213ps_fma(auVar61,auVar153,ZEXT1632(auVar33));
      auVar61 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar37));
      auVar43 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar61,auVar153);
      auVar61 = vmulps_avx512vl(auVar61,auVar243._0_32_);
      auVar41 = vmulss_avx512f(ZEXT416((uint)fVar207),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar191 = auVar41._0_4_;
      auVar143._0_8_ =
           CONCAT44(auVar43._4_4_ + fVar191 * auVar61._4_4_,auVar43._0_4_ + fVar191 * auVar61._0_4_)
      ;
      auVar143._8_4_ = auVar43._8_4_ + fVar191 * auVar61._8_4_;
      auVar143._12_4_ = auVar43._12_4_ + fVar191 * auVar61._12_4_;
      auVar115._0_4_ = fVar191 * auVar61._16_4_;
      auVar115._4_4_ = fVar191 * auVar61._20_4_;
      auVar115._8_4_ = fVar191 * auVar61._24_4_;
      auVar115._12_4_ = fVar191 * auVar61._28_4_;
      auVar84 = vsubps_avx((undefined1  [16])0x0,auVar115);
      auVar31 = vshufpd_avx(auVar43,auVar43,3);
      auVar32 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar41 = vsubps_avx(auVar31,auVar43);
      auVar37 = vsubps_avx(auVar32,(undefined1  [16])0x0);
      auVar161._0_4_ = auVar37._0_4_ + auVar41._0_4_;
      auVar161._4_4_ = auVar37._4_4_ + auVar41._4_4_;
      auVar161._8_4_ = auVar37._8_4_ + auVar41._8_4_;
      auVar161._12_4_ = auVar37._12_4_ + auVar41._12_4_;
      auVar41 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar37 = vshufps_avx(auVar143,auVar143,0xb1);
      auVar36 = vshufps_avx(auVar84,auVar84,0xb1);
      auVar40 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar222._4_4_ = auVar161._0_4_;
      auVar222._0_4_ = auVar161._0_4_;
      auVar222._8_4_ = auVar161._0_4_;
      auVar222._12_4_ = auVar161._0_4_;
      auVar33 = vshufps_avx(auVar161,auVar161,0x55);
      fVar191 = auVar33._0_4_;
      auVar176._0_4_ = auVar41._0_4_ * fVar191;
      fVar202 = auVar33._4_4_;
      auVar176._4_4_ = auVar41._4_4_ * fVar202;
      fVar203 = auVar33._8_4_;
      auVar176._8_4_ = auVar41._8_4_ * fVar203;
      fVar204 = auVar33._12_4_;
      auVar176._12_4_ = auVar41._12_4_ * fVar204;
      auVar187._0_4_ = auVar37._0_4_ * fVar191;
      auVar187._4_4_ = auVar37._4_4_ * fVar202;
      auVar187._8_4_ = auVar37._8_4_ * fVar203;
      auVar187._12_4_ = auVar37._12_4_ * fVar204;
      auVar194._0_4_ = auVar36._0_4_ * fVar191;
      auVar194._4_4_ = auVar36._4_4_ * fVar202;
      auVar194._8_4_ = auVar36._8_4_ * fVar203;
      auVar194._12_4_ = auVar36._12_4_ * fVar204;
      auVar162._0_4_ = auVar40._0_4_ * fVar191;
      auVar162._4_4_ = auVar40._4_4_ * fVar202;
      auVar162._8_4_ = auVar40._8_4_ * fVar203;
      auVar162._12_4_ = auVar40._12_4_ * fVar204;
      auVar41 = vfmadd231ps_fma(auVar176,auVar222,auVar43);
      auVar37 = vfmadd231ps_fma(auVar187,auVar222,auVar143);
      auVar33 = vfmadd231ps_fma(auVar194,auVar222,auVar84);
      auVar85 = vfmadd231ps_fma(auVar162,(undefined1  [16])0x0,auVar222);
      auVar42 = vshufpd_avx(auVar41,auVar41,1);
      auVar34 = vshufpd_avx(auVar37,auVar37,1);
      auVar35 = vshufpd_avx(auVar33,auVar33,1);
      auVar78 = vshufpd_avx(auVar85,auVar85,1);
      auVar36 = vminss_avx(auVar41,auVar37);
      auVar41 = vmaxss_avx(auVar37,auVar41);
      auVar40 = vminss_avx(auVar33,auVar85);
      auVar37 = vmaxss_avx(auVar85,auVar33);
      auVar40 = vminss_avx(auVar36,auVar40);
      auVar41 = vmaxss_avx(auVar37,auVar41);
      auVar33 = vminss_avx(auVar42,auVar34);
      auVar37 = vmaxss_avx(auVar34,auVar42);
      auVar42 = vminss_avx(auVar35,auVar78);
      auVar36 = vmaxss_avx(auVar78,auVar35);
      auVar33 = vminss_avx(auVar33,auVar42);
      auVar37 = vmaxss_avx(auVar36,auVar37);
      vucomiss_avx512f(auVar40);
      if ((uVar26 < 5) || (auVar37 = vucomiss_avx512f(auVar29), uVar26 < 5)) {
        auVar41 = vucomiss_avx512f(auVar29);
        uVar11 = vcmpps_avx512vl(auVar33,auVar30,1);
        uVar12 = vcmpps_avx512vl(auVar40,auVar30,1);
        if ((4 < uVar26 & ((byte)uVar12 | (byte)uVar11)) != 0) goto LAB_01b718fa;
        uVar11 = vcmpps_avx512vl(auVar29,auVar37,5);
        uVar12 = vcmpps_avx512vl(auVar33,auVar30,5);
        if ((((ushort)uVar12 | (ushort)uVar11) & 1) == 0) goto LAB_01b718fa;
        bVar13 = true;
        auVar242 = ZEXT1664(auVar241);
      }
      else {
LAB_01b718fa:
        uVar11 = vcmpss_avx512f(auVar40,in_ZMM16._0_16_,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        iVar76 = auVar244._0_4_;
        fVar191 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar76);
        uVar11 = vcmpss_avx512f(auVar41,ZEXT816(0) << 0x20,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        fVar202 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar76);
        auVar61._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar65._4_28_ = auVar61._4_28_;
        auVar65._0_4_ = (uint)(fVar191 == fVar202) * 0x7f800000;
        auVar30 = auVar65._0_16_;
        auVar67._16_16_ = auVar61._16_16_;
        auVar67._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar66._4_28_ = auVar67._4_28_;
        auVar66._0_4_ = (uint)(fVar191 == fVar202) * -0x800000;
        auVar29 = auVar66._0_16_;
        uVar11 = vcmpss_avx512f(auVar33,ZEXT816(0) << 0x20,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        fVar203 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar76);
        auVar36 = ZEXT416(0xbf800000);
        if ((fVar191 != fVar203) || (NAN(fVar191) || NAN(fVar203))) {
          fVar204 = auVar33._0_4_;
          fVar191 = auVar40._0_4_;
          bVar13 = fVar204 == fVar191;
          if ((!bVar13) || (NAN(fVar204) || NAN(fVar191))) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar40 = vxorps_avx512vl(auVar40,auVar17);
            auVar237._0_4_ = auVar40._0_4_ / (fVar204 - fVar191);
            auVar237._4_12_ = auVar40._4_12_;
            auVar40 = vsubss_avx512f(auVar39,auVar237);
            auVar33 = vxorps_avx512vl(auVar36,auVar36);
            auVar40 = vfmadd213ss_avx512f(auVar40,auVar33,auVar237);
            auVar36 = auVar40;
          }
          else {
            auVar33 = vxorps_avx512vl(auVar36,auVar36);
            vucomiss_avx512f(auVar33);
            auVar69._16_16_ = auVar61._16_16_;
            auVar69._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar68._4_28_ = auVar69._4_28_;
            auVar68._0_4_ = (uint)bVar13 * auVar33._0_4_ + (uint)!bVar13 * 0x7f800000;
            auVar40 = auVar68._0_16_;
            auVar36 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar30 = vminss_avx(auVar30,auVar40);
          auVar29 = vmaxss_avx(auVar36,auVar29);
        }
        else {
          auVar33 = vxorps_avx512vl(auVar36,auVar36);
        }
        in_ZMM16 = ZEXT1664(auVar33);
        auVar242 = ZEXT1664(auVar241);
        uVar11 = vcmpss_avx512f(auVar37,auVar33,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        fVar191 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar76);
        if ((fVar202 != fVar191) || (NAN(fVar202) || NAN(fVar191))) {
          fVar204 = auVar37._0_4_;
          fVar202 = auVar41._0_4_;
          bVar13 = fVar204 == fVar202;
          if ((!bVar13) || (NAN(fVar204) || NAN(fVar202))) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar41 = vxorps_avx512vl(auVar41,auVar16);
            auVar195._0_4_ = auVar41._0_4_ / (fVar204 - fVar202);
            auVar195._4_12_ = auVar41._4_12_;
            auVar41 = vsubss_avx512f(auVar39,auVar195);
            auVar37 = vfmadd213ss_avx512f(auVar41,auVar33,auVar195);
            auVar41 = auVar37;
          }
          else {
            vucomiss_avx512f(auVar33);
            auVar71._16_16_ = auVar61._16_16_;
            auVar71._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar70._4_28_ = auVar71._4_28_;
            auVar70._0_4_ = (uint)bVar13 * auVar33._0_4_ + (uint)!bVar13 * 0x7f800000;
            auVar37 = auVar70._0_16_;
            auVar41 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar30 = vminss_avx(auVar30,auVar37);
          auVar29 = vmaxss_avx(auVar41,auVar29);
        }
        bVar13 = fVar203 != fVar191;
        auVar41 = vminss_avx512f(auVar30,auVar39);
        auVar73._16_16_ = auVar61._16_16_;
        auVar73._0_16_ = auVar30;
        auVar72._4_28_ = auVar73._4_28_;
        auVar72._0_4_ = (uint)bVar13 * auVar41._0_4_ + (uint)!bVar13 * auVar30._0_4_;
        auVar30 = vmaxss_avx512f(auVar39,auVar29);
        auVar75._16_16_ = auVar61._16_16_;
        auVar75._0_16_ = auVar29;
        auVar74._4_28_ = auVar75._4_28_;
        auVar74._0_4_ = (uint)bVar13 * auVar30._0_4_ + (uint)!bVar13 * auVar29._0_4_;
        auVar29 = vmaxss_avx512f(auVar33,auVar72._0_16_);
        auVar30 = vminss_avx512f(auVar74._0_16_,auVar39);
        bVar13 = true;
        if (auVar29._0_4_ <= auVar30._0_4_) {
          auVar34 = vmaxss_avx512f(auVar33,ZEXT416((uint)(auVar29._0_4_ + -0.1)));
          auVar35 = vminss_avx512f(ZEXT416((uint)(auVar30._0_4_ + 0.1)),auVar39);
          auVar91._0_8_ = auVar43._0_8_;
          auVar91._8_8_ = auVar91._0_8_;
          auVar188._8_8_ = auVar143._0_8_;
          auVar188._0_8_ = auVar143._0_8_;
          auVar196._8_8_ = auVar84._0_8_;
          auVar196._0_8_ = auVar84._0_8_;
          auVar29 = vshufpd_avx(auVar143,auVar143,3);
          auVar30 = vshufpd_avx(auVar84,auVar84,3);
          auVar41 = vshufps_avx(auVar34,auVar35,0);
          auVar223._8_4_ = 0x3f800000;
          auVar223._0_8_ = &DAT_3f8000003f800000;
          auVar223._12_4_ = 0x3f800000;
          auVar37 = vsubps_avx(auVar223,auVar41);
          fVar191 = auVar41._0_4_;
          auVar232._0_4_ = fVar191 * auVar31._0_4_;
          fVar202 = auVar41._4_4_;
          auVar232._4_4_ = fVar202 * auVar31._4_4_;
          fVar203 = auVar41._8_4_;
          auVar232._8_4_ = fVar203 * auVar31._8_4_;
          fVar204 = auVar41._12_4_;
          auVar232._12_4_ = fVar204 * auVar31._12_4_;
          auVar144._0_4_ = fVar191 * auVar29._0_4_;
          auVar144._4_4_ = fVar202 * auVar29._4_4_;
          auVar144._8_4_ = fVar203 * auVar29._8_4_;
          auVar144._12_4_ = fVar204 * auVar29._12_4_;
          auVar150._0_4_ = fVar191 * auVar30._0_4_;
          auVar150._4_4_ = fVar202 * auVar30._4_4_;
          auVar150._8_4_ = fVar203 * auVar30._8_4_;
          auVar150._12_4_ = fVar204 * auVar30._12_4_;
          auVar116._0_4_ = fVar191 * auVar32._0_4_;
          auVar116._4_4_ = fVar202 * auVar32._4_4_;
          auVar116._8_4_ = fVar203 * auVar32._8_4_;
          auVar116._12_4_ = fVar204 * auVar32._12_4_;
          auVar36 = vfmadd231ps_fma(auVar232,auVar37,auVar91);
          auVar40 = vfmadd231ps_fma(auVar144,auVar37,auVar188);
          auVar33 = vfmadd231ps_fma(auVar150,auVar37,auVar196);
          auVar42 = vfmadd231ps_fma(auVar116,auVar37,ZEXT816(0));
          auVar30 = vsubss_avx512f(auVar39,auVar34);
          auVar29 = vmovshdup_avx(auVar241);
          auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ * auVar34._0_4_)),auVar241,auVar30)
          ;
          auVar30 = vsubss_avx512f(auVar39,auVar35);
          auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * auVar29._0_4_)),auVar241,auVar30)
          ;
          auVar31 = vdivss_avx512f(auVar39,ZEXT416((uint)fVar207));
          auVar29 = vsubps_avx(auVar40,auVar36);
          auVar104._0_4_ = auVar29._0_4_ * 3.0;
          auVar104._4_4_ = auVar29._4_4_ * 3.0;
          auVar104._8_4_ = auVar29._8_4_ * 3.0;
          auVar104._12_4_ = auVar29._12_4_ * 3.0;
          auVar29 = vsubps_avx(auVar33,auVar40);
          auVar163._0_4_ = auVar29._0_4_ * 3.0;
          auVar163._4_4_ = auVar29._4_4_ * 3.0;
          auVar163._8_4_ = auVar29._8_4_ * 3.0;
          auVar163._12_4_ = auVar29._12_4_ * 3.0;
          auVar29 = vsubps_avx(auVar42,auVar33);
          auVar177._0_4_ = auVar29._0_4_ * 3.0;
          auVar177._4_4_ = auVar29._4_4_ * 3.0;
          auVar177._8_4_ = auVar29._8_4_ * 3.0;
          auVar177._12_4_ = auVar29._12_4_ * 3.0;
          auVar30 = vminps_avx(auVar163,auVar177);
          auVar29 = vmaxps_avx(auVar163,auVar177);
          auVar30 = vminps_avx(auVar104,auVar30);
          auVar29 = vmaxps_avx(auVar104,auVar29);
          auVar41 = vshufpd_avx(auVar30,auVar30,3);
          auVar37 = vshufpd_avx(auVar29,auVar29,3);
          auVar30 = vminps_avx(auVar30,auVar41);
          auVar29 = vmaxps_avx(auVar29,auVar37);
          fVar207 = auVar31._0_4_;
          auVar178._0_4_ = fVar207 * auVar30._0_4_;
          auVar178._4_4_ = fVar207 * auVar30._4_4_;
          auVar178._8_4_ = fVar207 * auVar30._8_4_;
          auVar178._12_4_ = fVar207 * auVar30._12_4_;
          auVar164._0_4_ = fVar207 * auVar29._0_4_;
          auVar164._4_4_ = fVar207 * auVar29._4_4_;
          auVar164._8_4_ = fVar207 * auVar29._8_4_;
          auVar164._12_4_ = fVar207 * auVar29._12_4_;
          auVar31 = vdivss_avx512f(auVar39,ZEXT416((uint)(auVar85._0_4_ - auVar84._0_4_)));
          auVar29 = vshufpd_avx(auVar36,auVar36,3);
          auVar30 = vshufpd_avx(auVar40,auVar40,3);
          auVar41 = vshufpd_avx(auVar33,auVar33,3);
          auVar37 = vshufpd_avx(auVar42,auVar42,3);
          auVar29 = vsubps_avx(auVar29,auVar36);
          auVar36 = vsubps_avx(auVar30,auVar40);
          auVar40 = vsubps_avx(auVar41,auVar33);
          auVar37 = vsubps_avx(auVar37,auVar42);
          auVar30 = vminps_avx(auVar29,auVar36);
          auVar29 = vmaxps_avx(auVar29,auVar36);
          auVar41 = vminps_avx(auVar40,auVar37);
          auVar41 = vminps_avx(auVar30,auVar41);
          auVar30 = vmaxps_avx(auVar40,auVar37);
          auVar29 = vmaxps_avx(auVar29,auVar30);
          fVar207 = auVar31._0_4_;
          auVar197._0_4_ = fVar207 * auVar41._0_4_;
          auVar197._4_4_ = fVar207 * auVar41._4_4_;
          auVar197._8_4_ = fVar207 * auVar41._8_4_;
          auVar197._12_4_ = fVar207 * auVar41._12_4_;
          auVar211._0_4_ = fVar207 * auVar29._0_4_;
          auVar211._4_4_ = fVar207 * auVar29._4_4_;
          auVar211._8_4_ = fVar207 * auVar29._8_4_;
          auVar211._12_4_ = fVar207 * auVar29._12_4_;
          auVar36 = vinsertps_avx(local_2e8,auVar84,0x10);
          auVar40 = vinsertps_avx(auVar38,auVar85,0x10);
          auVar83._0_4_ = auVar36._0_4_ + auVar40._0_4_;
          auVar83._4_4_ = auVar36._4_4_ + auVar40._4_4_;
          auVar83._8_4_ = auVar36._8_4_ + auVar40._8_4_;
          auVar83._12_4_ = auVar36._12_4_ + auVar40._12_4_;
          auVar14._8_4_ = 0x3f000000;
          auVar14._0_8_ = 0x3f0000003f000000;
          auVar14._12_4_ = 0x3f000000;
          auVar35 = vmulps_avx512vl(auVar83,auVar14);
          auVar41 = vshufps_avx(auVar35,auVar35,0x54);
          uVar77 = auVar35._0_4_;
          auVar105._4_4_ = uVar77;
          auVar105._0_4_ = uVar77;
          auVar105._8_4_ = uVar77;
          auVar105._12_4_ = uVar77;
          auVar33 = vfmadd213ps_avx512vl(auVar248._0_16_,auVar105,auVar246._0_16_);
          auVar30 = vfmadd213ps_fma(auVar249._0_16_,auVar105,local_2c8);
          auVar37 = vfmadd213ps_fma(local_c8,auVar105,local_2d8);
          in_ZMM27 = ZEXT1664(local_2e8);
          auVar29 = vsubps_avx(auVar30,auVar33);
          auVar33 = vfmadd213ps_fma(auVar29,auVar105,auVar33);
          auVar29 = vsubps_avx(auVar37,auVar30);
          auVar29 = vfmadd213ps_fma(auVar29,auVar105,auVar30);
          auVar29 = vsubps_avx(auVar29,auVar33);
          auVar30 = vfmadd231ps_fma(auVar33,auVar29,auVar105);
          auVar106._0_8_ = CONCAT44(auVar29._4_4_ * 3.0,auVar29._0_4_ * 3.0);
          auVar106._8_4_ = auVar29._8_4_ * 3.0;
          auVar106._12_4_ = auVar29._12_4_ * 3.0;
          auVar224._8_8_ = auVar30._0_8_;
          auVar224._0_8_ = auVar30._0_8_;
          auVar29 = vshufpd_avx(auVar30,auVar30,3);
          auVar30 = vshufps_avx(auVar35,auVar35,0x55);
          auVar37 = vsubps_avx(auVar29,auVar224);
          auVar33 = vfmadd231ps_fma(auVar224,auVar30,auVar37);
          auVar238._8_8_ = auVar106._0_8_;
          auVar238._0_8_ = auVar106._0_8_;
          auVar29 = vshufpd_avx(auVar106,auVar106,3);
          auVar29 = vsubps_avx(auVar29,auVar238);
          auVar30 = vfmadd213ps_fma(auVar29,auVar30,auVar238);
          auVar42 = vxorps_avx512vl(auVar37,auVar247._0_16_);
          auVar29 = vmovshdup_avx(auVar30);
          auVar31 = vxorps_avx512vl(auVar29,auVar247._0_16_);
          auVar32 = vmovshdup_avx512vl(auVar37);
          auVar31 = vpermt2ps_avx512vl(auVar31,ZEXT416(5),auVar37);
          auVar29 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar29._0_4_ * auVar37._0_4_)),auVar30,
                                        auVar32);
          auVar30 = vpermt2ps_avx512vl(auVar30,SUB6416(ZEXT464(4),0),auVar42);
          auVar117._0_4_ = auVar29._0_4_;
          auVar117._4_4_ = auVar117._0_4_;
          auVar117._8_4_ = auVar117._0_4_;
          auVar117._12_4_ = auVar117._0_4_;
          auVar29 = vdivps_avx(auVar31,auVar117);
          auVar30 = vdivps_avx(auVar30,auVar117);
          fVar191 = auVar33._0_4_;
          auVar37 = vshufps_avx(auVar33,auVar33,0x55);
          fVar207 = auVar30._0_4_;
          auVar225._0_4_ = fVar191 * auVar29._0_4_ + auVar37._0_4_ * fVar207;
          auVar225._4_4_ = fVar191 * auVar29._4_4_ + auVar37._4_4_ * auVar30._4_4_;
          auVar225._8_4_ = fVar191 * auVar29._8_4_ + auVar37._8_4_ * auVar30._8_4_;
          auVar225._12_4_ = fVar191 * auVar29._12_4_ + auVar37._12_4_ * auVar30._12_4_;
          auVar78 = vsubps_avx(auVar41,auVar225);
          auVar33 = vmovshdup_avx(auVar29);
          auVar41 = vinsertps_avx(auVar178,auVar197,0x1c);
          auVar239._0_4_ = auVar33._0_4_ * auVar41._0_4_;
          auVar239._4_4_ = auVar33._4_4_ * auVar41._4_4_;
          auVar239._8_4_ = auVar33._8_4_ * auVar41._8_4_;
          auVar239._12_4_ = auVar33._12_4_ * auVar41._12_4_;
          auVar37 = vinsertps_avx(auVar164,auVar211,0x1c);
          auVar226._0_4_ = auVar33._0_4_ * auVar37._0_4_;
          auVar226._4_4_ = auVar33._4_4_ * auVar37._4_4_;
          auVar226._8_4_ = auVar33._8_4_ * auVar37._8_4_;
          auVar226._12_4_ = auVar33._12_4_ * auVar37._12_4_;
          auVar34 = vminps_avx512vl(auVar239,auVar226);
          auVar31 = vmaxps_avx(auVar226,auVar239);
          auVar32 = vmovshdup_avx(auVar30);
          auVar33 = vinsertps_avx(auVar197,auVar178,0x4c);
          auVar198._0_4_ = auVar32._0_4_ * auVar33._0_4_;
          auVar198._4_4_ = auVar32._4_4_ * auVar33._4_4_;
          auVar198._8_4_ = auVar32._8_4_ * auVar33._8_4_;
          auVar198._12_4_ = auVar32._12_4_ * auVar33._12_4_;
          auVar42 = vinsertps_avx(auVar211,auVar164,0x4c);
          auVar212._0_4_ = auVar32._0_4_ * auVar42._0_4_;
          auVar212._4_4_ = auVar32._4_4_ * auVar42._4_4_;
          auVar212._8_4_ = auVar32._8_4_ * auVar42._8_4_;
          auVar212._12_4_ = auVar32._12_4_ * auVar42._12_4_;
          auVar32 = vminps_avx(auVar198,auVar212);
          auVar34 = vaddps_avx512vl(auVar34,auVar32);
          auVar32 = vmaxps_avx(auVar212,auVar198);
          auVar199._0_4_ = auVar31._0_4_ + auVar32._0_4_;
          auVar199._4_4_ = auVar31._4_4_ + auVar32._4_4_;
          auVar199._8_4_ = auVar31._8_4_ + auVar32._8_4_;
          auVar199._12_4_ = auVar31._12_4_ + auVar32._12_4_;
          auVar213._8_8_ = 0x3f80000000000000;
          auVar213._0_8_ = 0x3f80000000000000;
          auVar31 = vsubps_avx(auVar213,auVar199);
          auVar32 = vsubps_avx(auVar213,auVar34);
          auVar34 = vsubps_avx(auVar36,auVar35);
          auVar35 = vsubps_avx(auVar40,auVar35);
          fVar205 = auVar34._0_4_;
          auVar240._0_4_ = fVar205 * auVar31._0_4_;
          fVar206 = auVar34._4_4_;
          auVar240._4_4_ = fVar206 * auVar31._4_4_;
          fVar96 = auVar34._8_4_;
          auVar240._8_4_ = fVar96 * auVar31._8_4_;
          fVar109 = auVar34._12_4_;
          auVar240._12_4_ = fVar109 * auVar31._12_4_;
          auVar43 = vbroadcastss_avx512vl(auVar29);
          auVar41 = vmulps_avx512vl(auVar43,auVar41);
          auVar37 = vmulps_avx512vl(auVar43,auVar37);
          auVar43 = vminps_avx512vl(auVar41,auVar37);
          auVar41 = vmaxps_avx(auVar37,auVar41);
          auVar179._0_4_ = fVar207 * auVar33._0_4_;
          auVar179._4_4_ = fVar207 * auVar33._4_4_;
          auVar179._8_4_ = fVar207 * auVar33._8_4_;
          auVar179._12_4_ = fVar207 * auVar33._12_4_;
          auVar165._0_4_ = fVar207 * auVar42._0_4_;
          auVar165._4_4_ = fVar207 * auVar42._4_4_;
          auVar165._8_4_ = fVar207 * auVar42._8_4_;
          auVar165._12_4_ = fVar207 * auVar42._12_4_;
          auVar37 = vminps_avx(auVar179,auVar165);
          auVar33 = vaddps_avx512vl(auVar43,auVar37);
          auVar42 = vmulps_avx512vl(auVar34,auVar32);
          fVar191 = auVar35._0_4_;
          auVar200._0_4_ = fVar191 * auVar31._0_4_;
          fVar202 = auVar35._4_4_;
          auVar200._4_4_ = fVar202 * auVar31._4_4_;
          fVar203 = auVar35._8_4_;
          auVar200._8_4_ = fVar203 * auVar31._8_4_;
          fVar204 = auVar35._12_4_;
          auVar200._12_4_ = fVar204 * auVar31._12_4_;
          auVar214._0_4_ = fVar191 * auVar32._0_4_;
          auVar214._4_4_ = fVar202 * auVar32._4_4_;
          auVar214._8_4_ = fVar203 * auVar32._8_4_;
          auVar214._12_4_ = fVar204 * auVar32._12_4_;
          auVar37 = vmaxps_avx(auVar165,auVar179);
          auVar166._0_4_ = auVar41._0_4_ + auVar37._0_4_;
          auVar166._4_4_ = auVar41._4_4_ + auVar37._4_4_;
          auVar166._8_4_ = auVar41._8_4_ + auVar37._8_4_;
          auVar166._12_4_ = auVar41._12_4_ + auVar37._12_4_;
          auVar180._8_8_ = 0x3f800000;
          auVar180._0_8_ = 0x3f800000;
          auVar41 = vsubps_avx(auVar180,auVar166);
          auVar37 = vsubps_avx(auVar180,auVar33);
          auVar233._0_4_ = fVar205 * auVar41._0_4_;
          auVar233._4_4_ = fVar206 * auVar41._4_4_;
          auVar233._8_4_ = fVar96 * auVar41._8_4_;
          auVar233._12_4_ = fVar109 * auVar41._12_4_;
          auVar227._0_4_ = fVar205 * auVar37._0_4_;
          auVar227._4_4_ = fVar206 * auVar37._4_4_;
          auVar227._8_4_ = fVar96 * auVar37._8_4_;
          auVar227._12_4_ = fVar109 * auVar37._12_4_;
          auVar167._0_4_ = fVar191 * auVar41._0_4_;
          auVar167._4_4_ = fVar202 * auVar41._4_4_;
          auVar167._8_4_ = fVar203 * auVar41._8_4_;
          auVar167._12_4_ = fVar204 * auVar41._12_4_;
          auVar181._0_4_ = fVar191 * auVar37._0_4_;
          auVar181._4_4_ = fVar202 * auVar37._4_4_;
          auVar181._8_4_ = fVar203 * auVar37._8_4_;
          auVar181._12_4_ = fVar204 * auVar37._12_4_;
          auVar41 = vminps_avx(auVar233,auVar227);
          auVar37 = vminps_avx(auVar167,auVar181);
          auVar33 = vminps_avx(auVar41,auVar37);
          auVar41 = vmaxps_avx(auVar227,auVar233);
          auVar37 = vmaxps_avx(auVar181,auVar167);
          auVar37 = vmaxps_avx(auVar37,auVar41);
          auVar31 = vminps_avx512vl(auVar240,auVar42);
          auVar41 = vminps_avx(auVar200,auVar214);
          auVar41 = vminps_avx(auVar31,auVar41);
          auVar41 = vhaddps_avx(auVar33,auVar41);
          auVar31 = vmaxps_avx512vl(auVar42,auVar240);
          auVar33 = vmaxps_avx(auVar214,auVar200);
          auVar33 = vmaxps_avx(auVar33,auVar31);
          auVar37 = vhaddps_avx(auVar37,auVar33);
          auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
          auVar37 = vshufps_avx(auVar37,auVar37,0xe8);
          auVar168._0_4_ = auVar41._0_4_ + auVar78._0_4_;
          auVar168._4_4_ = auVar41._4_4_ + auVar78._4_4_;
          auVar168._8_4_ = auVar41._8_4_ + auVar78._8_4_;
          auVar168._12_4_ = auVar41._12_4_ + auVar78._12_4_;
          auVar182._0_4_ = auVar37._0_4_ + auVar78._0_4_;
          auVar182._4_4_ = auVar37._4_4_ + auVar78._4_4_;
          auVar182._8_4_ = auVar37._8_4_ + auVar78._8_4_;
          auVar182._12_4_ = auVar37._12_4_ + auVar78._12_4_;
          auVar41 = vmaxps_avx(auVar36,auVar168);
          auVar37 = vminps_avx(auVar182,auVar40);
          uVar25 = vcmpps_avx512vl(auVar37,auVar41,1);
          local_2f8 = vinsertps_avx(auVar84,auVar85,0x10);
          auVar242 = ZEXT1664(local_2f8);
          if ((uVar25 & 3) == 0) {
            vucomiss_avx512f(local_2e8);
            auVar41 = vxorps_avx512vl(auVar42,auVar42);
            in_ZMM16 = ZEXT1664(auVar41);
            auVar246 = ZEXT1664(local_338);
            if (uVar26 < 4 && (uVar5 == 0 || lVar24 == 0)) {
              bVar13 = false;
            }
            else {
              lVar24 = 200;
              do {
                auVar37 = vsubss_avx512f(auVar39,auVar78);
                fVar203 = auVar37._0_4_;
                fVar191 = fVar203 * fVar203 * fVar203;
                fVar204 = auVar78._0_4_;
                fVar202 = fVar204 * 3.0 * fVar203 * fVar203;
                fVar203 = fVar203 * fVar204 * fVar204 * 3.0;
                auVar145._4_4_ = fVar191;
                auVar145._0_4_ = fVar191;
                auVar145._8_4_ = fVar191;
                auVar145._12_4_ = fVar191;
                auVar132._4_4_ = fVar202;
                auVar132._0_4_ = fVar202;
                auVar132._8_4_ = fVar202;
                auVar132._12_4_ = fVar202;
                auVar92._4_4_ = fVar203;
                auVar92._0_4_ = fVar203;
                auVar92._8_4_ = fVar203;
                auVar92._12_4_ = fVar203;
                fVar204 = fVar204 * fVar204 * fVar204;
                auVar151._0_4_ = (float)local_1e8._0_4_ * fVar204;
                auVar151._4_4_ = (float)local_1e8._4_4_ * fVar204;
                auVar151._8_4_ = fStack_1e0 * fVar204;
                auVar151._12_4_ = fStack_1dc * fVar204;
                auVar37 = vfmadd231ps_fma(auVar151,local_2d8,auVar92);
                auVar37 = vfmadd231ps_fma(auVar37,local_2c8,auVar132);
                auVar37 = vfmadd231ps_avx512vl(auVar37,local_338,auVar145);
                auVar93._8_8_ = auVar37._0_8_;
                auVar93._0_8_ = auVar37._0_8_;
                auVar37 = vshufpd_avx(auVar37,auVar37,3);
                auVar36 = vshufps_avx(auVar78,auVar78,0x55);
                auVar37 = vsubps_avx(auVar37,auVar93);
                auVar36 = vfmadd213ps_fma(auVar37,auVar36,auVar93);
                fVar191 = auVar36._0_4_;
                auVar37 = vshufps_avx(auVar36,auVar36,0x55);
                auVar94._0_4_ = auVar29._0_4_ * fVar191 + fVar207 * auVar37._0_4_;
                auVar94._4_4_ = auVar29._4_4_ * fVar191 + auVar30._4_4_ * auVar37._4_4_;
                auVar94._8_4_ = auVar29._8_4_ * fVar191 + auVar30._8_4_ * auVar37._8_4_;
                auVar94._12_4_ = auVar29._12_4_ * fVar191 + auVar30._12_4_ * auVar37._12_4_;
                auVar78 = vsubps_avx(auVar78,auVar94);
                auVar37 = vandps_avx512vl(auVar36,auVar245._0_16_);
                auVar36 = vprolq_avx512vl(auVar37,0x20);
                auVar37 = vmaxss_avx(auVar36,auVar37);
                bVar10 = auVar37._0_4_ <= (float)local_1f8._0_4_;
                if (auVar37._0_4_ < (float)local_1f8._0_4_) {
                  auVar29 = vucomiss_avx512f(auVar41);
                  if (bVar10) {
                    auVar30 = vucomiss_avx512f(auVar29);
                    auVar244 = ZEXT1664(auVar30);
                    if (bVar10) {
                      vmovshdup_avx(auVar29);
                      auVar30 = vucomiss_avx512f(auVar41);
                      if (bVar10) {
                        auVar37 = vucomiss_avx512f(auVar30);
                        auVar244 = ZEXT1664(auVar37);
                        if (bVar10) {
                          auVar39 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2])
                                                  ,ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]
                                                          ),0x1c);
                          auVar34 = vinsertps_avx(auVar39,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                          aVar1 = (ray->org).field_0;
                          auVar39 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                          auVar39 = vdpps_avx(auVar39,auVar34,0x7f);
                          auVar36 = vsubps_avx(local_248,(undefined1  [16])aVar1);
                          auVar36 = vdpps_avx(auVar36,auVar34,0x7f);
                          auVar40 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                          auVar40 = vdpps_avx(auVar40,auVar34,0x7f);
                          auVar33 = vsubps_avx(local_228,(undefined1  [16])aVar1);
                          auVar33 = vdpps_avx(auVar33,auVar34,0x7f);
                          auVar42 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                          auVar42 = vdpps_avx(auVar42,auVar34,0x7f);
                          auVar31 = vsubps_avx(_local_268,(undefined1  [16])aVar1);
                          auVar31 = vdpps_avx(auVar31,auVar34,0x7f);
                          auVar32 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                          auVar32 = vdpps_avx(auVar32,auVar34,0x7f);
                          auVar35 = vsubps_avx(_local_238,(undefined1  [16])aVar1);
                          auVar34 = vdpps_avx(auVar35,auVar34,0x7f);
                          auVar35 = vsubss_avx512f(auVar37,auVar30);
                          fVar207 = auVar30._0_4_;
                          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar207)),auVar35
                                                    ,auVar39);
                          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ * fVar207)),auVar35
                                                    ,auVar36);
                          auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * fVar207)),auVar35
                                                    ,auVar40);
                          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar34._0_4_)),auVar35
                                                    ,auVar33);
                          auVar37 = vsubss_avx512f(auVar37,auVar29);
                          auVar152._0_4_ = auVar37._0_4_;
                          fVar207 = auVar152._0_4_ * auVar152._0_4_ * auVar152._0_4_;
                          fVar203 = auVar29._0_4_;
                          fVar191 = fVar203 * 3.0 * auVar152._0_4_ * auVar152._0_4_;
                          fVar202 = auVar152._0_4_ * fVar203 * fVar203 * 3.0;
                          fVar205 = fVar203 * fVar203 * fVar203;
                          auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar40._0_4_)),
                                                    ZEXT416((uint)fVar202),auVar36);
                          auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar191),auVar39);
                          auVar30 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar207),auVar30);
                          fVar204 = auVar30._0_4_;
                          if (((ray->org).field_0.m128[3] <= fVar204) &&
                             (fVar206 = ray->tfar, fVar204 <= fVar206)) {
                            auVar30 = vshufps_avx(auVar29,auVar29,0x55);
                            auVar183._8_4_ = 0x3f800000;
                            auVar183._0_8_ = &DAT_3f8000003f800000;
                            auVar183._12_4_ = 0x3f800000;
                            auVar37 = vsubps_avx(auVar183,auVar30);
                            fVar96 = auVar30._0_4_;
                            auVar189._0_4_ = fVar96 * (float)local_218._0_4_;
                            fVar109 = auVar30._4_4_;
                            auVar189._4_4_ = fVar109 * (float)local_218._4_4_;
                            fVar122 = auVar30._8_4_;
                            auVar189._8_4_ = fVar122 * fStack_210;
                            fVar123 = auVar30._12_4_;
                            auVar189._12_4_ = fVar123 * fStack_20c;
                            auVar201._0_4_ = fVar96 * (float)local_268._0_4_;
                            auVar201._4_4_ = fVar109 * (float)local_268._4_4_;
                            auVar201._8_4_ = fVar122 * fStack_260;
                            auVar201._12_4_ = fVar123 * fStack_25c;
                            auVar215._0_4_ = fVar96 * (float)local_278._0_4_;
                            auVar215._4_4_ = fVar109 * (float)local_278._4_4_;
                            auVar215._8_4_ = fVar122 * fStack_270;
                            auVar215._12_4_ = fVar123 * fStack_26c;
                            auVar169._0_4_ = fVar96 * (float)local_238._0_4_;
                            auVar169._4_4_ = fVar109 * (float)local_238._4_4_;
                            auVar169._8_4_ = fVar122 * fStack_230;
                            auVar169._12_4_ = fVar123 * fStack_22c;
                            auVar30 = vfmadd231ps_fma(auVar189,auVar37,local_208);
                            auVar39 = vfmadd231ps_fma(auVar201,auVar37,local_248);
                            auVar36 = vfmadd231ps_fma(auVar215,auVar37,local_258);
                            auVar40 = vfmadd231ps_fma(auVar169,auVar37,local_228);
                            auVar30 = vsubps_avx(auVar39,auVar30);
                            auVar37 = vsubps_avx(auVar36,auVar39);
                            auVar39 = vsubps_avx(auVar40,auVar36);
                            auVar216._0_4_ = fVar203 * auVar37._0_4_;
                            auVar216._4_4_ = fVar203 * auVar37._4_4_;
                            auVar216._8_4_ = fVar203 * auVar37._8_4_;
                            auVar216._12_4_ = fVar203 * auVar37._12_4_;
                            auVar152._4_4_ = auVar152._0_4_;
                            auVar152._8_4_ = auVar152._0_4_;
                            auVar152._12_4_ = auVar152._0_4_;
                            auVar30 = vfmadd231ps_fma(auVar216,auVar152,auVar30);
                            auVar170._0_4_ = fVar203 * auVar39._0_4_;
                            auVar170._4_4_ = fVar203 * auVar39._4_4_;
                            auVar170._8_4_ = fVar203 * auVar39._8_4_;
                            auVar170._12_4_ = fVar203 * auVar39._12_4_;
                            auVar37 = vfmadd231ps_fma(auVar170,auVar152,auVar37);
                            auVar171._0_4_ = fVar203 * auVar37._0_4_;
                            auVar171._4_4_ = fVar203 * auVar37._4_4_;
                            auVar171._8_4_ = fVar203 * auVar37._8_4_;
                            auVar171._12_4_ = fVar203 * auVar37._12_4_;
                            auVar30 = vfmadd231ps_fma(auVar171,auVar152,auVar30);
                            auVar15._8_4_ = 0x40400000;
                            auVar15._0_8_ = 0x4040000040400000;
                            auVar15._12_4_ = 0x40400000;
                            auVar30 = vmulps_avx512vl(auVar30,auVar15);
                            pGVar6 = (context->scene->geometries).items[local_320].ptr;
                            if ((pGVar6->mask & ray->mask) == 0) {
                              bVar10 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar10 = true,
                                    pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar146._0_4_ = fVar205 * (float)local_118._0_4_;
                              auVar146._4_4_ = fVar205 * (float)local_118._4_4_;
                              auVar146._8_4_ = fVar205 * fStack_110;
                              auVar146._12_4_ = fVar205 * fStack_10c;
                              auVar133._4_4_ = fVar202;
                              auVar133._0_4_ = fVar202;
                              auVar133._8_4_ = fVar202;
                              auVar133._12_4_ = fVar202;
                              auVar37 = vfmadd132ps_fma(auVar133,auVar146,local_108);
                              auVar118._4_4_ = fVar191;
                              auVar118._0_4_ = fVar191;
                              auVar118._8_4_ = fVar191;
                              auVar118._12_4_ = fVar191;
                              auVar37 = vfmadd132ps_fma(auVar118,auVar37,local_f8);
                              auVar107._4_4_ = fVar207;
                              auVar107._0_4_ = fVar207;
                              auVar107._8_4_ = fVar207;
                              auVar107._12_4_ = fVar207;
                              auVar36 = vfmadd132ps_fma(auVar107,auVar37,local_e8);
                              auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
                              auVar39 = vshufps_avx(auVar30,auVar30,0xc9);
                              auVar108._0_4_ = auVar36._0_4_ * auVar39._0_4_;
                              auVar108._4_4_ = auVar36._4_4_ * auVar39._4_4_;
                              auVar108._8_4_ = auVar36._8_4_ * auVar39._8_4_;
                              auVar108._12_4_ = auVar36._12_4_ * auVar39._12_4_;
                              auVar37 = vfmsub231ps_fma(auVar108,auVar30,auVar37);
                              auVar30 = vshufps_avx(auVar37,auVar37,0xe9);
                              local_148 = vmovlps_avx(auVar30);
                              local_140 = auVar37._0_4_;
                              local_13c = vmovlps_avx(auVar29);
                              local_134 = (int)local_2b8;
                              local_130 = (int)local_320;
                              local_12c = context->user->instID[0];
                              local_128 = context->user->instPrimID[0];
                              ray->tfar = fVar204;
                              local_33c = -1;
                              local_2a8.valid = &local_33c;
                              local_2a8.geometryUserPtr = pGVar6->userPtr;
                              local_2a8.context = context->user;
                              local_2a8.hit = (RTCHitN *)&local_148;
                              local_2a8.N = 1;
                              local_2a8.ray = (RTCRayN *)ray;
                              if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b7242b:
                                auVar29 = in_ZMM16._0_16_;
                                p_Var7 = context->args->filter;
                                if (p_Var7 != (RTCFilterFunctionN)0x0) {
                                  if (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                     (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                    (*p_Var7)(&local_2a8);
                                    auVar242 = ZEXT1664(local_2f8);
                                    auVar249 = ZEXT1664(local_318);
                                    auVar248 = ZEXT1664(local_308);
                                    auVar246 = ZEXT1664(local_338);
                                    auVar29 = vxorps_avx512vl(auVar29,auVar29);
                                    in_ZMM16 = ZEXT1664(auVar29);
                                    auVar244 = ZEXT464(0x3f800000);
                                    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar243 = ZEXT3264(auVar61);
                                    auVar29 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar247 = ZEXT1664(auVar29);
                                    auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar245 = ZEXT1664(auVar29);
                                  }
                                  if (*local_2a8.valid == 0) goto LAB_01b7255e;
                                }
                                bVar10 = true;
                              }
                              else {
                                (*pGVar6->occlusionFilterN)(&local_2a8);
                                auVar242 = ZEXT1664(local_2f8);
                                auVar249 = ZEXT1664(local_318);
                                auVar248 = ZEXT1664(local_308);
                                auVar246 = ZEXT1664(local_338);
                                auVar29 = vxorps_avx512vl(auVar41,auVar41);
                                in_ZMM16 = ZEXT1664(auVar29);
                                auVar244 = ZEXT464(0x3f800000);
                                auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar243 = ZEXT3264(auVar61);
                                auVar29 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar247 = ZEXT1664(auVar29);
                                auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar245 = ZEXT1664(auVar29);
                                if (*local_2a8.valid != 0) goto LAB_01b7242b;
LAB_01b7255e:
                                bVar10 = false;
                              }
                              if (!bVar10) {
                                ray->tfar = fVar206;
                              }
                            }
                            bVar27 = (bool)(bVar27 | bVar10);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar24 = lVar24 + -1;
              } while (lVar24 != 0);
            }
          }
          else {
            auVar29 = vxorps_avx512vl(auVar42,auVar42);
            in_ZMM16 = ZEXT1664(auVar29);
            auVar246 = ZEXT1664(local_338);
          }
        }
      }
    } while (bVar13);
    auVar29 = vinsertps_avx(local_2e8,auVar38,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }